

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx512::CurveNiIntersectorK<4,8>::
     intersect_t<embree::avx512::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,8,8>,embree::avx512::Intersect1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [16];
  undefined1 (*pauVar5) [12];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  Primitive PVar8;
  uint uVar9;
  undefined4 uVar10;
  RTCFilterFunctionN p_Var11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  ulong uVar27;
  long lVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  int iVar56;
  int iVar57;
  int iVar58;
  int iVar59;
  int iVar60;
  undefined8 uVar61;
  undefined8 uVar62;
  undefined8 uVar63;
  undefined8 uVar64;
  undefined8 uVar65;
  undefined1 auVar66 [16];
  undefined1 auVar67 [32];
  byte bVar68;
  ulong uVar69;
  uint uVar70;
  uint uVar71;
  int iVar72;
  ulong uVar73;
  uint uVar74;
  long lVar75;
  Geometry *pGVar76;
  ulong uVar77;
  byte bVar78;
  float fVar79;
  float fVar80;
  float fVar134;
  float fVar136;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar90 [16];
  float fVar135;
  float fVar137;
  float fVar139;
  float fVar140;
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  float fVar138;
  float fVar141;
  float fVar142;
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined4 uVar143;
  float fVar157;
  float fVar158;
  vint4 bi_2;
  float fVar159;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  vint4 bi_1;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [32];
  float fVar165;
  vint4 bi;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  float fVar172;
  float fVar188;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  vint4 ai_2;
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [64];
  vint4 ai;
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar206 [64];
  vint4 ai_1;
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [64];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [16];
  undefined1 auVar217 [64];
  undefined1 auVar218 [16];
  undefined1 auVar219 [32];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar223 [32];
  undefined1 auVar227 [64];
  undefined1 auVar228 [64];
  undefined1 auVar229 [64];
  undefined1 auVar230 [64];
  undefined1 auVar231 [64];
  RTCFilterFunctionNArguments args;
  float local_6c0;
  float fStack_6bc;
  float fStack_6b8;
  float fStack_6b4;
  RTCFilterFunctionNArguments local_678;
  undefined1 (*local_648) [32];
  undefined1 local_640 [32];
  ulong local_608;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined8 local_5a0;
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined4 local_4e0;
  undefined4 uStack_4dc;
  undefined4 uStack_4d8;
  undefined4 uStack_4d4;
  undefined4 uStack_4d0;
  undefined4 uStack_4cc;
  undefined4 uStack_4c8;
  undefined4 uStack_4c4;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  undefined4 uStack_484;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined4 local_340;
  int local_33c;
  undefined1 local_330 [16];
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  float local_2e0 [4];
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_270 [16];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  int local_220;
  int iStack_21c;
  int iStack_218;
  int iStack_214;
  int iStack_210;
  int iStack_20c;
  int iStack_208;
  int iStack_204;
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined4 local_1a0;
  undefined4 uStack_19c;
  undefined4 uStack_198;
  undefined4 uStack_194;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  undefined4 uStack_188;
  undefined4 uStack_184;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined1 local_160 [32];
  uint local_140;
  uint uStack_13c;
  uint uStack_138;
  uint uStack_134;
  uint uStack_130;
  uint uStack_12c;
  uint uStack_128;
  uint uStack_124;
  uint local_120;
  uint uStack_11c;
  uint uStack_118;
  uint uStack_114;
  uint uStack_110;
  uint uStack_10c;
  uint uStack_108;
  uint uStack_104;
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar224 [32];
  
  PVar8 = prim[1];
  uVar73 = (ulong)(byte)PVar8;
  fVar165 = *(float *)(prim + uVar73 * 0x19 + 0x12);
  auVar81 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar81 = vinsertps_avx(auVar81,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar82 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar82 = vinsertps_avx(auVar82,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar81 = vsubps_avx(auVar81,*(undefined1 (*) [16])(prim + uVar73 * 0x19 + 6));
  auVar173._0_4_ = fVar165 * auVar81._0_4_;
  auVar173._4_4_ = fVar165 * auVar81._4_4_;
  auVar173._8_4_ = fVar165 * auVar81._8_4_;
  auVar173._12_4_ = fVar165 * auVar81._12_4_;
  auVar85._0_4_ = fVar165 * auVar82._0_4_;
  auVar85._4_4_ = fVar165 * auVar82._4_4_;
  auVar85._8_4_ = fVar165 * auVar82._8_4_;
  auVar85._12_4_ = fVar165 * auVar82._12_4_;
  auVar81 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 4 + 6)));
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar82 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 5 + 6)));
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar89 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 6 + 6)));
  auVar146 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 0xb + 6)));
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar146 = vcvtdq2ps_avx(auVar146);
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar8 * 0xc) + 6)));
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar8 * 0xc + uVar73 + 6)));
  auVar20 = vcvtdq2ps_avx(auVar20);
  uVar77 = (ulong)(uint)((int)(uVar73 * 9) * 2);
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar77 + 6)));
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar77 + uVar73 + 6)));
  auVar22 = vcvtdq2ps_avx(auVar22);
  uVar69 = (ulong)(uint)((int)(uVar73 * 5) << 2);
  auVar23 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 + 6)));
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar220._4_4_ = auVar85._0_4_;
  auVar220._0_4_ = auVar85._0_4_;
  auVar220._8_4_ = auVar85._0_4_;
  auVar220._12_4_ = auVar85._0_4_;
  auVar88 = vshufps_avx(auVar85,auVar85,0x55);
  auVar84 = vshufps_avx(auVar85,auVar85,0xaa);
  fVar165 = auVar84._0_4_;
  auVar90._0_4_ = fVar165 * auVar89._0_4_;
  fVar157 = auVar84._4_4_;
  auVar90._4_4_ = fVar157 * auVar89._4_4_;
  fVar158 = auVar84._8_4_;
  auVar90._8_4_ = fVar158 * auVar89._8_4_;
  fVar159 = auVar84._12_4_;
  auVar90._12_4_ = fVar159 * auVar89._12_4_;
  auVar86._0_4_ = auVar20._0_4_ * fVar165;
  auVar86._4_4_ = auVar20._4_4_ * fVar157;
  auVar86._8_4_ = auVar20._8_4_ * fVar158;
  auVar86._12_4_ = auVar20._12_4_ * fVar159;
  auVar144._0_4_ = auVar23._0_4_ * fVar165;
  auVar144._4_4_ = auVar23._4_4_ * fVar157;
  auVar144._8_4_ = auVar23._8_4_ * fVar158;
  auVar144._12_4_ = auVar23._12_4_ * fVar159;
  auVar84 = vfmadd231ps_fma(auVar90,auVar88,auVar82);
  auVar83 = vfmadd231ps_fma(auVar86,auVar88,auVar19);
  auVar88 = vfmadd231ps_fma(auVar144,auVar22,auVar88);
  auVar87 = vfmadd231ps_fma(auVar84,auVar220,auVar81);
  auVar83 = vfmadd231ps_fma(auVar83,auVar220,auVar146);
  auVar85 = vfmadd231ps_fma(auVar88,auVar21,auVar220);
  auVar221._4_4_ = auVar173._0_4_;
  auVar221._0_4_ = auVar173._0_4_;
  auVar221._8_4_ = auVar173._0_4_;
  auVar221._12_4_ = auVar173._0_4_;
  auVar88 = vshufps_avx(auVar173,auVar173,0x55);
  auVar84 = vshufps_avx(auVar173,auVar173,0xaa);
  fVar165 = auVar84._0_4_;
  auVar222._0_4_ = fVar165 * auVar89._0_4_;
  fVar157 = auVar84._4_4_;
  auVar222._4_4_ = fVar157 * auVar89._4_4_;
  fVar158 = auVar84._8_4_;
  auVar222._8_4_ = fVar158 * auVar89._8_4_;
  fVar159 = auVar84._12_4_;
  auVar222._12_4_ = fVar159 * auVar89._12_4_;
  auVar189._0_4_ = auVar20._0_4_ * fVar165;
  auVar189._4_4_ = auVar20._4_4_ * fVar157;
  auVar189._8_4_ = auVar20._8_4_ * fVar158;
  auVar189._12_4_ = auVar20._12_4_ * fVar159;
  auVar174._0_4_ = auVar23._0_4_ * fVar165;
  auVar174._4_4_ = auVar23._4_4_ * fVar157;
  auVar174._8_4_ = auVar23._8_4_ * fVar158;
  auVar174._12_4_ = auVar23._12_4_ * fVar159;
  auVar82 = vfmadd231ps_fma(auVar222,auVar88,auVar82);
  auVar89 = vfmadd231ps_fma(auVar189,auVar88,auVar19);
  auVar19 = vfmadd231ps_fma(auVar174,auVar88,auVar22);
  auVar20 = vfmadd231ps_fma(auVar82,auVar221,auVar81);
  auVar22 = vfmadd231ps_fma(auVar89,auVar221,auVar146);
  auVar81 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar229 = ZEXT1664(auVar81);
  auVar23 = vfmadd231ps_fma(auVar19,auVar221,auVar21);
  auVar82 = vandps_avx512vl(auVar87,auVar81);
  auVar207._8_4_ = 0x219392ef;
  auVar207._0_8_ = 0x219392ef219392ef;
  auVar207._12_4_ = 0x219392ef;
  uVar77 = vcmpps_avx512vl(auVar82,auVar207,1);
  bVar12 = (bool)((byte)uVar77 & 1);
  auVar84._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar87._0_4_;
  bVar12 = (bool)((byte)(uVar77 >> 1) & 1);
  auVar84._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar87._4_4_;
  bVar12 = (bool)((byte)(uVar77 >> 2) & 1);
  auVar84._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar87._8_4_;
  bVar12 = (bool)((byte)(uVar77 >> 3) & 1);
  auVar84._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar87._12_4_;
  auVar82 = vandps_avx512vl(auVar83,auVar81);
  uVar77 = vcmpps_avx512vl(auVar82,auVar207,1);
  bVar12 = (bool)((byte)uVar77 & 1);
  auVar87._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar83._0_4_;
  bVar12 = (bool)((byte)(uVar77 >> 1) & 1);
  auVar87._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar83._4_4_;
  bVar12 = (bool)((byte)(uVar77 >> 2) & 1);
  auVar87._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar83._8_4_;
  bVar12 = (bool)((byte)(uVar77 >> 3) & 1);
  auVar87._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar83._12_4_;
  auVar81 = vandps_avx512vl(auVar85,auVar81);
  uVar77 = vcmpps_avx512vl(auVar81,auVar207,1);
  bVar12 = (bool)((byte)uVar77 & 1);
  auVar83._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar85._0_4_;
  bVar12 = (bool)((byte)(uVar77 >> 1) & 1);
  auVar83._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar85._4_4_;
  bVar12 = (bool)((byte)(uVar77 >> 2) & 1);
  auVar83._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar85._8_4_;
  bVar12 = (bool)((byte)(uVar77 >> 3) & 1);
  auVar83._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar85._12_4_;
  auVar82 = vrcp14ps_avx512vl(auVar84);
  auVar208._8_4_ = 0x3f800000;
  auVar208._0_8_ = 0x3f8000003f800000;
  auVar208._12_4_ = 0x3f800000;
  auVar81 = vfnmadd213ps_fma(auVar84,auVar82,auVar208);
  auVar146 = vfmadd132ps_fma(auVar81,auVar82,auVar82);
  auVar82 = vrcp14ps_avx512vl(auVar87);
  auVar81 = vfnmadd213ps_fma(auVar87,auVar82,auVar208);
  auVar19 = vfmadd132ps_fma(auVar81,auVar82,auVar82);
  auVar82 = vrcp14ps_avx512vl(auVar83);
  auVar81 = vfnmadd213ps_fma(auVar83,auVar82,auVar208);
  auVar21 = vfmadd132ps_fma(auVar81,auVar82,auVar82);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar73 * 7 + 6);
  auVar81 = vpmovsxwd_avx(auVar81);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar81 = vsubps_avx(auVar81,auVar20);
  auVar197._0_4_ = auVar146._0_4_ * auVar81._0_4_;
  auVar197._4_4_ = auVar146._4_4_ * auVar81._4_4_;
  auVar197._8_4_ = auVar146._8_4_ * auVar81._8_4_;
  auVar197._12_4_ = auVar146._12_4_ * auVar81._12_4_;
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar73 * 9 + 6);
  auVar81 = vpmovsxwd_avx(auVar82);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar81 = vsubps_avx(auVar81,auVar20);
  auVar84 = vpbroadcastd_avx512vl();
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + 6);
  auVar82 = vpmovsxwd_avx(auVar89);
  auVar166._0_4_ = auVar146._0_4_ * auVar81._0_4_;
  auVar166._4_4_ = auVar146._4_4_ * auVar81._4_4_;
  auVar166._8_4_ = auVar146._8_4_ * auVar81._8_4_;
  auVar166._12_4_ = auVar146._12_4_ * auVar81._12_4_;
  auVar146._8_8_ = 0;
  auVar146._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + uVar73 * -2 + 6);
  auVar81 = vpmovsxwd_avx(auVar146);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar81 = vsubps_avx(auVar81,auVar22);
  auVar209._0_4_ = auVar19._0_4_ * auVar81._0_4_;
  auVar209._4_4_ = auVar19._4_4_ * auVar81._4_4_;
  auVar209._8_4_ = auVar19._8_4_ * auVar81._8_4_;
  auVar209._12_4_ = auVar19._12_4_ * auVar81._12_4_;
  auVar81 = vcvtdq2ps_avx(auVar82);
  auVar81 = vsubps_avx(auVar81,auVar22);
  auVar160._0_4_ = auVar19._0_4_ * auVar81._0_4_;
  auVar160._4_4_ = auVar19._4_4_ * auVar81._4_4_;
  auVar160._8_4_ = auVar19._8_4_ * auVar81._8_4_;
  auVar160._12_4_ = auVar19._12_4_ * auVar81._12_4_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar69 + uVar73 + 6);
  auVar81 = vpmovsxwd_avx(auVar19);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar81 = vsubps_avx(auVar81,auVar23);
  auVar190._0_4_ = auVar21._0_4_ * auVar81._0_4_;
  auVar190._4_4_ = auVar21._4_4_ * auVar81._4_4_;
  auVar190._8_4_ = auVar21._8_4_ * auVar81._8_4_;
  auVar190._12_4_ = auVar21._12_4_ * auVar81._12_4_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar73 * 0x17 + 6);
  auVar81 = vpmovsxwd_avx(auVar20);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar81 = vsubps_avx(auVar81,auVar23);
  auVar145._0_4_ = auVar21._0_4_ * auVar81._0_4_;
  auVar145._4_4_ = auVar21._4_4_ * auVar81._4_4_;
  auVar145._8_4_ = auVar21._8_4_ * auVar81._8_4_;
  auVar145._12_4_ = auVar21._12_4_ * auVar81._12_4_;
  auVar81 = vpminsd_avx(auVar197,auVar166);
  auVar82 = vpminsd_avx(auVar209,auVar160);
  auVar81 = vmaxps_avx(auVar81,auVar82);
  auVar82 = vpminsd_avx(auVar190,auVar145);
  uVar143 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar21._4_4_ = uVar143;
  auVar21._0_4_ = uVar143;
  auVar21._8_4_ = uVar143;
  auVar21._12_4_ = uVar143;
  auVar82 = vmaxps_avx512vl(auVar82,auVar21);
  auVar81 = vmaxps_avx(auVar81,auVar82);
  auVar22._8_4_ = 0x3f7ffffa;
  auVar22._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar22._12_4_ = 0x3f7ffffa;
  local_270 = vmulps_avx512vl(auVar81,auVar22);
  auVar81 = vpmaxsd_avx(auVar197,auVar166);
  auVar82 = vpmaxsd_avx(auVar209,auVar160);
  auVar81 = vminps_avx(auVar81,auVar82);
  auVar82 = vpmaxsd_avx(auVar190,auVar145);
  uVar143 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar23._4_4_ = uVar143;
  auVar23._0_4_ = uVar143;
  auVar23._8_4_ = uVar143;
  auVar23._12_4_ = uVar143;
  auVar82 = vminps_avx512vl(auVar82,auVar23);
  auVar81 = vminps_avx(auVar81,auVar82);
  auVar88._8_4_ = 0x3f800003;
  auVar88._0_8_ = 0x3f8000033f800003;
  auVar88._12_4_ = 0x3f800003;
  auVar81 = vmulps_avx512vl(auVar81,auVar88);
  uVar24 = vcmpps_avx512vl(local_270,auVar81,2);
  uVar77 = vpcmpgtd_avx512vl(auVar84,_DAT_01f7fcf0);
  uVar77 = ((byte)uVar24 & 0xf) & uVar77;
  if ((char)uVar77 != '\0') {
    local_648 = (undefined1 (*) [32])&local_140;
    local_260 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
    do {
      lVar28 = 0;
      for (uVar69 = uVar77; (uVar69 & 1) == 0; uVar69 = uVar69 >> 1 | 0x8000000000000000) {
        lVar28 = lVar28 + 1;
      }
      uVar74 = *(uint *)(prim + 2);
      uVar9 = *(uint *)(prim + lVar28 * 4 + 6);
      pGVar76 = (context->scene->geometries).items[uVar74].ptr;
      uVar69 = (ulong)*(uint *)(*(long *)&pGVar76->field_0x58 +
                               pGVar76[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i * (ulong)uVar9);
      p_Var11 = pGVar76[1].intersectionFilterN;
      lVar28 = *(long *)&pGVar76[1].time_range.upper;
      auVar81 = *(undefined1 (*) [16])(lVar28 + (long)p_Var11 * uVar69);
      pauVar3 = (undefined1 (*) [16])(lVar28 + (uVar69 + 1) * (long)p_Var11);
      uVar24 = *(undefined8 *)*pauVar3;
      uVar61 = *(undefined8 *)(*pauVar3 + 8);
      auVar23 = *pauVar3;
      auVar21 = *pauVar3;
      auVar19 = *pauVar3;
      auVar82 = *pauVar3;
      pauVar4 = (undefined1 (*) [16])(lVar28 + (uVar69 + 2) * (long)p_Var11);
      uVar62 = *(undefined8 *)*pauVar4;
      uVar63 = *(undefined8 *)(*pauVar4 + 8);
      auVar22 = *pauVar4;
      auVar20 = *pauVar4;
      auVar146 = *pauVar4;
      auVar89 = *pauVar4;
      uVar77 = uVar77 - 1 & uVar77;
      pauVar5 = (undefined1 (*) [12])(lVar28 + (uVar69 + 3) * (long)p_Var11);
      uVar64 = *(undefined8 *)*pauVar5;
      uVar65 = *(undefined8 *)(*pauVar5 + 8);
      local_6c0 = (float)uVar64;
      fStack_6bc = (float)((ulong)uVar64 >> 0x20);
      fStack_6b8 = (float)uVar65;
      fStack_6b4 = (float)((ulong)uVar65 >> 0x20);
      if (uVar77 != 0) {
        uVar73 = uVar77 - 1 & uVar77;
        for (uVar69 = uVar77; (uVar69 & 1) == 0; uVar69 = uVar69 >> 1 | 0x8000000000000000) {
        }
        if (uVar73 != 0) {
          for (; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x8000000000000000) {
          }
        }
      }
      iVar72 = (int)pGVar76[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar88 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20))
                              ,0x1c);
      auVar88 = vinsertps_avx(auVar88,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      auVar83 = vsubps_avx(auVar81,auVar88);
      uVar143 = auVar83._0_4_;
      auVar167._4_4_ = uVar143;
      auVar167._0_4_ = uVar143;
      auVar167._8_4_ = uVar143;
      auVar167._12_4_ = uVar143;
      auVar84 = vshufps_avx(auVar83,auVar83,0x55);
      auVar83 = vshufps_avx(auVar83,auVar83,0xaa);
      aVar6 = pre->ray_space[k].vx.field_0;
      aVar7 = pre->ray_space[k].vy.field_0;
      fVar165 = pre->ray_space[k].vz.field_0.m128[0];
      fVar157 = pre->ray_space[k].vz.field_0.m128[1];
      fVar158 = pre->ray_space[k].vz.field_0.m128[2];
      fVar159 = pre->ray_space[k].vz.field_0.m128[3];
      auVar212._0_4_ = fVar165 * auVar83._0_4_;
      auVar212._4_4_ = fVar157 * auVar83._4_4_;
      auVar212._8_4_ = fVar158 * auVar83._8_4_;
      auVar212._12_4_ = fVar159 * auVar83._12_4_;
      auVar84 = vfmadd231ps_fma(auVar212,(undefined1  [16])aVar7,auVar84);
      auVar144 = vfmadd231ps_fma(auVar84,(undefined1  [16])aVar6,auVar167);
      auVar84 = vshufps_avx(auVar81,auVar81,0xff);
      auVar87 = vsubps_avx(auVar82,auVar88);
      uVar143 = auVar87._0_4_;
      auVar175._4_4_ = uVar143;
      auVar175._0_4_ = uVar143;
      auVar175._8_4_ = uVar143;
      auVar175._12_4_ = uVar143;
      auVar83 = vshufps_avx(auVar87,auVar87,0x55);
      auVar87 = vshufps_avx(auVar87,auVar87,0xaa);
      auVar213._0_4_ = fVar165 * auVar87._0_4_;
      auVar213._4_4_ = fVar157 * auVar87._4_4_;
      auVar213._8_4_ = fVar158 * auVar87._8_4_;
      auVar213._12_4_ = fVar159 * auVar87._12_4_;
      auVar83 = vfmadd231ps_fma(auVar213,(undefined1  [16])aVar7,auVar83);
      auVar145 = vfmadd231ps_fma(auVar83,(undefined1  [16])aVar6,auVar175);
      auVar83 = vshufps_avx(auVar82,auVar82,0xff);
      auVar85 = vsubps_avx512vl(auVar89,auVar88);
      uVar143 = auVar85._0_4_;
      auVar210._4_4_ = uVar143;
      auVar210._0_4_ = uVar143;
      auVar210._8_4_ = uVar143;
      auVar210._12_4_ = uVar143;
      auVar87 = vshufps_avx(auVar85,auVar85,0x55);
      auVar85 = vshufps_avx(auVar85,auVar85,0xaa);
      auVar216._0_4_ = fVar165 * auVar85._0_4_;
      auVar216._4_4_ = fVar157 * auVar85._4_4_;
      auVar216._8_4_ = fVar158 * auVar85._8_4_;
      auVar216._12_4_ = fVar159 * auVar85._12_4_;
      auVar87 = vfmadd231ps_fma(auVar216,(undefined1  [16])aVar7,auVar87);
      auVar85 = vfmadd231ps_fma(auVar87,(undefined1  [16])aVar6,auVar210);
      auVar86 = vshufps_avx512vl(auVar89,auVar89,0xff);
      auVar66._12_4_ = fStack_6b4;
      auVar66._0_12_ = *pauVar5;
      auVar87 = vsubps_avx512vl(auVar66,auVar88);
      uVar143 = auVar87._0_4_;
      auVar176._4_4_ = uVar143;
      auVar176._0_4_ = uVar143;
      auVar176._8_4_ = uVar143;
      auVar176._12_4_ = uVar143;
      auVar88 = vshufps_avx(auVar87,auVar87,0x55);
      auVar87 = vshufps_avx(auVar87,auVar87,0xaa);
      auVar218._0_4_ = fVar165 * auVar87._0_4_;
      auVar218._4_4_ = fVar157 * auVar87._4_4_;
      auVar218._8_4_ = fVar158 * auVar87._8_4_;
      auVar218._12_4_ = fVar159 * auVar87._12_4_;
      auVar88 = vfmadd231ps_fma(auVar218,(undefined1  [16])aVar7,auVar88);
      auVar87 = vfmadd231ps_fma(auVar88,(undefined1  [16])aVar6,auVar176);
      lVar28 = (long)iVar72 * 0x44;
      auVar107 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar28);
      auVar88 = vshufps_avx512vl(auVar66,auVar66,0xff);
      uVar143 = auVar144._0_4_;
      local_3c0._4_4_ = uVar143;
      local_3c0._0_4_ = uVar143;
      local_3c0._8_4_ = uVar143;
      local_3c0._12_4_ = uVar143;
      local_3c0._16_4_ = uVar143;
      local_3c0._20_4_ = uVar143;
      local_3c0._24_4_ = uVar143;
      local_3c0._28_4_ = uVar143;
      auVar91._8_4_ = 1;
      auVar91._0_8_ = 0x100000001;
      auVar91._12_4_ = 1;
      auVar91._16_4_ = 1;
      auVar91._20_4_ = 1;
      auVar91._24_4_ = 1;
      auVar91._28_4_ = 1;
      local_3e0 = vpermps_avx2(auVar91,ZEXT1632(auVar144));
      local_80 = vbroadcastsd_avx512vl(auVar84);
      auVar108 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar28 + 0x484);
      uVar143 = auVar145._0_4_;
      auVar161._4_4_ = uVar143;
      auVar161._0_4_ = uVar143;
      auVar161._8_4_ = uVar143;
      auVar161._12_4_ = uVar143;
      local_400._16_4_ = uVar143;
      local_400._0_16_ = auVar161;
      local_400._20_4_ = uVar143;
      local_400._24_4_ = uVar143;
      local_400._28_4_ = uVar143;
      local_420 = vpermps_avx512vl(auVar91,ZEXT1632(auVar145));
      local_a0 = vbroadcastsd_avx512vl(auVar83);
      auVar105 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar28 + 0x908);
      uVar143 = auVar85._0_4_;
      local_440._4_4_ = uVar143;
      local_440._0_4_ = uVar143;
      local_440._8_4_ = uVar143;
      local_440._12_4_ = uVar143;
      local_440._16_4_ = uVar143;
      local_440._20_4_ = uVar143;
      local_440._24_4_ = uVar143;
      local_440._28_4_ = uVar143;
      local_460 = vpermps_avx512vl(auVar91,ZEXT1632(auVar85));
      local_c0 = vbroadcastsd_avx512vl(auVar86);
      auVar104 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar28 + 0xd8c);
      fVar157 = auVar87._0_4_;
      local_480._4_4_ = fVar157;
      local_480._0_4_ = fVar157;
      fStack_478 = fVar157;
      fStack_474 = fVar157;
      fStack_470 = fVar157;
      fStack_46c = fVar157;
      fStack_468 = fVar157;
      register0x0000139c = fVar157;
      _local_4a0 = vpermps_avx512vl(auVar91,ZEXT1632(auVar87));
      local_e0 = vbroadcastsd_avx512vl(auVar88);
      auVar91 = vmulps_avx512vl(_local_480,auVar104);
      auVar92 = vmulps_avx512vl(_local_4a0,auVar104);
      auVar88 = vfmadd231ps_fma(auVar91,auVar105,local_440);
      auVar91 = vfmadd231ps_avx512vl(auVar92,auVar105,local_460);
      auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar108,local_400);
      auVar93 = vfmadd231ps_avx512vl(auVar91,auVar108,local_420);
      auVar94 = vfmadd231ps_avx512vl(ZEXT1632(auVar88),auVar107,local_3c0);
      auVar206 = ZEXT3264(auVar94);
      auVar91 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar28);
      auVar92 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar28 + 0x484);
      auVar95 = vfmadd231ps_avx512vl(auVar93,auVar107,local_3e0);
      auVar196 = ZEXT3264(auVar95);
      auVar93 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar28 + 0x908);
      auVar103 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar28 + 0xd8c);
      auVar96 = vmulps_avx512vl(_local_480,auVar103);
      auVar97 = vmulps_avx512vl(_local_4a0,auVar103);
      auVar96 = vfmadd231ps_avx512vl(auVar96,auVar93,local_440);
      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar93,local_460);
      auVar96 = vfmadd231ps_avx512vl(auVar96,auVar92,local_400);
      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar92,local_420);
      auVar84 = vfmadd231ps_fma(auVar96,auVar91,local_3c0);
      auVar211 = ZEXT1664(auVar84);
      auVar83 = vfmadd231ps_fma(auVar97,auVar91,local_3e0);
      auVar96 = vsubps_avx512vl(ZEXT1632(auVar84),auVar94);
      auVar97 = vsubps_avx512vl(ZEXT1632(auVar83),auVar95);
      auVar98 = vmulps_avx512vl(auVar95,auVar96);
      auVar99 = vmulps_avx512vl(auVar94,auVar97);
      auVar98 = vsubps_avx512vl(auVar98,auVar99);
      auVar99 = vmulps_avx512vl(local_e0,auVar104);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar105,local_c0);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar108,local_a0);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar107,local_80);
      auVar100 = vmulps_avx512vl(local_e0,auVar103);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar93,local_c0);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar92,local_a0);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar91,local_80);
      auVar101 = vmulps_avx512vl(auVar97,auVar97);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar96,auVar96);
      auVar102 = vmaxps_avx512vl(auVar99,auVar100);
      auVar102 = vmulps_avx512vl(auVar102,auVar102);
      auVar101 = vmulps_avx512vl(auVar102,auVar101);
      auVar98 = vmulps_avx512vl(auVar98,auVar98);
      uVar25 = vcmpps_avx512vl(auVar98,auVar101,2);
      auVar88 = vblendps_avx(auVar144,auVar81,8);
      auVar86 = auVar229._0_16_;
      auVar88 = vandps_avx512vl(auVar88,auVar86);
      auVar82 = vblendps_avx(auVar145,auVar82,8);
      auVar82 = vandps_avx512vl(auVar82,auVar86);
      auVar88 = vmaxps_avx(auVar88,auVar82);
      auVar82 = vblendps_avx(auVar85,auVar89,8);
      auVar89 = vandps_avx512vl(auVar82,auVar86);
      auVar82 = vblendps_avx(auVar87,auVar66,8);
      auVar82 = vandps_avx512vl(auVar82,auVar86);
      auVar82 = vmaxps_avx(auVar89,auVar82);
      auVar82 = vmaxps_avx(auVar88,auVar82);
      auVar89 = vmovshdup_avx(auVar82);
      auVar89 = vmaxss_avx(auVar89,auVar82);
      auVar82 = vshufpd_avx(auVar82,auVar82,1);
      auVar82 = vmaxss_avx(auVar82,auVar89);
      auVar89 = vcvtsi2ss_avx512f(auVar86,iVar72);
      local_500._0_16_ = auVar89;
      auVar102._0_4_ = auVar89._0_4_;
      auVar102._4_4_ = auVar102._0_4_;
      auVar102._8_4_ = auVar102._0_4_;
      auVar102._12_4_ = auVar102._0_4_;
      auVar102._16_4_ = auVar102._0_4_;
      auVar102._20_4_ = auVar102._0_4_;
      auVar102._24_4_ = auVar102._0_4_;
      auVar102._28_4_ = auVar102._0_4_;
      uVar26 = vcmpps_avx512vl(auVar102,_DAT_01faff40,0xe);
      bVar78 = (byte)uVar25 & (byte)uVar26;
      fVar165 = auVar82._0_4_ * 4.7683716e-07;
      local_5e0._0_16_ = ZEXT416((uint)fVar165);
      auVar101._8_4_ = 2;
      auVar101._0_8_ = 0x200000002;
      auVar101._12_4_ = 2;
      auVar101._16_4_ = 2;
      auVar101._20_4_ = 2;
      auVar101._24_4_ = 2;
      auVar101._28_4_ = 2;
      local_560 = vpermps_avx512vl(auVar101,ZEXT1632(auVar144));
      auVar230 = ZEXT3264(local_560);
      local_580 = vpermps_avx512vl(auVar101,ZEXT1632(auVar145));
      auVar231 = ZEXT3264(local_580);
      auVar98 = vpermps_avx512vl(auVar101,ZEXT1632(auVar85));
      auVar228 = ZEXT3264(auVar98);
      local_240 = vpermps_avx2(auVar101,ZEXT1632(auVar87));
      local_4e0 = *(undefined4 *)(ray + k * 4 + 0x60);
      uStack_4dc = 0;
      uStack_4d8 = 0;
      uStack_4d4 = 0;
      if (bVar78 != 0) {
        auVar103 = vmulps_avx512vl(local_240,auVar103);
        auVar93 = vfmadd213ps_avx512vl(auVar93,auVar98,auVar103);
        auVar92 = vfmadd213ps_avx512vl(auVar92,local_580,auVar93);
        auVar101 = vfmadd213ps_avx512vl(auVar91,local_560,auVar92);
        auVar104 = vmulps_avx512vl(local_240,auVar104);
        auVar105 = vfmadd213ps_avx512vl(auVar105,auVar98,auVar104);
        auVar92 = vfmadd213ps_avx512vl(auVar108,local_580,auVar105);
        auVar108 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar28 + 0x1210);
        auVar105 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar28 + 0x1694);
        auVar104 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar28 + 0x1b18);
        auVar91 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar28 + 0x1f9c);
        auVar106 = vfmadd213ps_avx512vl(auVar107,local_560,auVar92);
        auVar214._0_4_ = fVar157 * auVar91._0_4_;
        auVar214._4_4_ = fVar157 * auVar91._4_4_;
        auVar214._8_4_ = fVar157 * auVar91._8_4_;
        auVar214._12_4_ = fVar157 * auVar91._12_4_;
        auVar214._16_4_ = fVar157 * auVar91._16_4_;
        auVar214._20_4_ = fVar157 * auVar91._20_4_;
        auVar214._24_4_ = fVar157 * auVar91._24_4_;
        auVar214._28_4_ = 0;
        auVar107 = vmulps_avx512vl(_local_4a0,auVar91);
        auVar91 = vmulps_avx512vl(local_240,auVar91);
        auVar92 = vfmadd231ps_avx512vl(auVar214,auVar104,local_440);
        auVar107 = vfmadd231ps_avx512vl(auVar107,auVar104,local_460);
        auVar104 = vfmadd231ps_avx512vl(auVar91,auVar98,auVar104);
        auVar91 = vfmadd231ps_avx512vl(auVar92,auVar105,local_400);
        auVar107 = vfmadd231ps_avx512vl(auVar107,auVar105,local_420);
        auVar92 = vfmadd231ps_avx512vl(auVar104,local_580,auVar105);
        auVar82 = vfmadd231ps_fma(auVar91,auVar108,local_3c0);
        auVar91 = vfmadd231ps_avx512vl(auVar107,auVar108,local_3e0);
        auVar107 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar28 + 0x1210);
        auVar105 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar28 + 0x1b18);
        auVar104 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar28 + 0x1f9c);
        auVar93 = vfmadd231ps_avx512vl(auVar92,local_560,auVar108);
        auVar92._4_4_ = fVar157 * auVar104._4_4_;
        auVar92._0_4_ = fVar157 * auVar104._0_4_;
        auVar92._8_4_ = fVar157 * auVar104._8_4_;
        auVar92._12_4_ = fVar157 * auVar104._12_4_;
        auVar92._16_4_ = fVar157 * auVar104._16_4_;
        auVar92._20_4_ = fVar157 * auVar104._20_4_;
        auVar92._24_4_ = fVar157 * auVar104._24_4_;
        auVar92._28_4_ = auVar108._28_4_;
        auVar108 = vmulps_avx512vl(_local_4a0,auVar104);
        auVar104 = vmulps_avx512vl(local_240,auVar104);
        auVar92 = vfmadd231ps_avx512vl(auVar92,auVar105,local_440);
        auVar103 = vfmadd231ps_avx512vl(auVar108,auVar105,local_460);
        auVar105 = vfmadd231ps_avx512vl(auVar104,auVar98,auVar105);
        auVar108 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar28 + 0x1694);
        auVar104 = vfmadd231ps_avx512vl(auVar92,auVar108,local_400);
        auVar92 = vfmadd231ps_avx512vl(auVar103,auVar108,local_420);
        auVar108 = vfmadd231ps_avx512vl(auVar105,local_580,auVar108);
        auVar89 = vfmadd231ps_fma(auVar104,auVar107,local_3c0);
        auVar105 = vfmadd231ps_avx512vl(auVar92,auVar107,local_3e0);
        auVar104 = vfmadd231ps_avx512vl(auVar108,local_560,auVar107);
        auVar223._8_4_ = 0x7fffffff;
        auVar223._0_8_ = 0x7fffffff7fffffff;
        auVar223._12_4_ = 0x7fffffff;
        auVar223._16_4_ = 0x7fffffff;
        auVar223._20_4_ = 0x7fffffff;
        auVar223._24_4_ = 0x7fffffff;
        auVar223._28_4_ = 0x7fffffff;
        auVar107 = vandps_avx(ZEXT1632(auVar82),auVar223);
        auVar108 = vandps_avx(auVar91,auVar223);
        auVar108 = vmaxps_avx(auVar107,auVar108);
        auVar107 = vandps_avx(auVar93,auVar223);
        auVar107 = vmaxps_avx(auVar108,auVar107);
        auVar219._4_4_ = fVar165;
        auVar219._0_4_ = fVar165;
        auVar219._8_4_ = fVar165;
        auVar219._12_4_ = fVar165;
        auVar219._16_4_ = fVar165;
        auVar219._20_4_ = fVar165;
        auVar219._24_4_ = fVar165;
        auVar219._28_4_ = fVar165;
        uVar69 = vcmpps_avx512vl(auVar107,auVar219,1);
        bVar12 = (bool)((byte)uVar69 & 1);
        auVar109._0_4_ = (float)((uint)bVar12 * auVar96._0_4_ | (uint)!bVar12 * auVar82._0_4_);
        bVar12 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar109._4_4_ = (float)((uint)bVar12 * auVar96._4_4_ | (uint)!bVar12 * auVar82._4_4_);
        bVar12 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar109._8_4_ = (float)((uint)bVar12 * auVar96._8_4_ | (uint)!bVar12 * auVar82._8_4_);
        bVar12 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar109._12_4_ = (float)((uint)bVar12 * auVar96._12_4_ | (uint)!bVar12 * auVar82._12_4_);
        fVar158 = (float)((uint)((byte)(uVar69 >> 4) & 1) * auVar96._16_4_);
        auVar109._16_4_ = fVar158;
        fVar165 = (float)((uint)((byte)(uVar69 >> 5) & 1) * auVar96._20_4_);
        auVar109._20_4_ = fVar165;
        fVar157 = (float)((uint)((byte)(uVar69 >> 6) & 1) * auVar96._24_4_);
        auVar109._24_4_ = fVar157;
        uVar70 = (uint)(byte)(uVar69 >> 7) * auVar96._28_4_;
        auVar109._28_4_ = uVar70;
        bVar12 = (bool)((byte)uVar69 & 1);
        auVar110._0_4_ = (float)((uint)bVar12 * auVar97._0_4_ | (uint)!bVar12 * auVar91._0_4_);
        bVar12 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar110._4_4_ = (float)((uint)bVar12 * auVar97._4_4_ | (uint)!bVar12 * auVar91._4_4_);
        bVar12 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar110._8_4_ = (float)((uint)bVar12 * auVar97._8_4_ | (uint)!bVar12 * auVar91._8_4_);
        bVar12 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar110._12_4_ = (float)((uint)bVar12 * auVar97._12_4_ | (uint)!bVar12 * auVar91._12_4_);
        bVar12 = (bool)((byte)(uVar69 >> 4) & 1);
        auVar110._16_4_ = (float)((uint)bVar12 * auVar97._16_4_ | (uint)!bVar12 * auVar91._16_4_);
        bVar12 = (bool)((byte)(uVar69 >> 5) & 1);
        auVar110._20_4_ = (float)((uint)bVar12 * auVar97._20_4_ | (uint)!bVar12 * auVar91._20_4_);
        bVar12 = (bool)((byte)(uVar69 >> 6) & 1);
        auVar110._24_4_ = (float)((uint)bVar12 * auVar97._24_4_ | (uint)!bVar12 * auVar91._24_4_);
        bVar12 = SUB81(uVar69 >> 7,0);
        auVar110._28_4_ = (uint)bVar12 * auVar97._28_4_ | (uint)!bVar12 * auVar91._28_4_;
        auVar107 = vandps_avx(auVar223,ZEXT1632(auVar89));
        auVar108 = vandps_avx(auVar105,auVar223);
        auVar108 = vmaxps_avx(auVar107,auVar108);
        auVar107 = vandps_avx(auVar104,auVar223);
        auVar107 = vmaxps_avx(auVar108,auVar107);
        uVar69 = vcmpps_avx512vl(auVar107,auVar219,1);
        bVar12 = (bool)((byte)uVar69 & 1);
        auVar111._0_4_ = (float)((uint)bVar12 * auVar96._0_4_ | (uint)!bVar12 * auVar89._0_4_);
        bVar12 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar111._4_4_ = (float)((uint)bVar12 * auVar96._4_4_ | (uint)!bVar12 * auVar89._4_4_);
        bVar12 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar111._8_4_ = (float)((uint)bVar12 * auVar96._8_4_ | (uint)!bVar12 * auVar89._8_4_);
        bVar12 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar111._12_4_ = (float)((uint)bVar12 * auVar96._12_4_ | (uint)!bVar12 * auVar89._12_4_);
        fVar188 = (float)((uint)((byte)(uVar69 >> 4) & 1) * auVar96._16_4_);
        auVar111._16_4_ = fVar188;
        fVar172 = (float)((uint)((byte)(uVar69 >> 5) & 1) * auVar96._20_4_);
        auVar111._20_4_ = fVar172;
        fVar159 = (float)((uint)((byte)(uVar69 >> 6) & 1) * auVar96._24_4_);
        auVar111._24_4_ = fVar159;
        auVar111._28_4_ = (uint)(byte)(uVar69 >> 7) * auVar96._28_4_;
        bVar12 = (bool)((byte)uVar69 & 1);
        auVar112._0_4_ = (float)((uint)bVar12 * auVar97._0_4_ | (uint)!bVar12 * auVar105._0_4_);
        bVar12 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar112._4_4_ = (float)((uint)bVar12 * auVar97._4_4_ | (uint)!bVar12 * auVar105._4_4_);
        bVar12 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar112._8_4_ = (float)((uint)bVar12 * auVar97._8_4_ | (uint)!bVar12 * auVar105._8_4_);
        bVar12 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar112._12_4_ = (float)((uint)bVar12 * auVar97._12_4_ | (uint)!bVar12 * auVar105._12_4_);
        bVar12 = (bool)((byte)(uVar69 >> 4) & 1);
        auVar112._16_4_ = (float)((uint)bVar12 * auVar97._16_4_ | (uint)!bVar12 * auVar105._16_4_);
        bVar12 = (bool)((byte)(uVar69 >> 5) & 1);
        auVar112._20_4_ = (float)((uint)bVar12 * auVar97._20_4_ | (uint)!bVar12 * auVar105._20_4_);
        bVar12 = (bool)((byte)(uVar69 >> 6) & 1);
        auVar112._24_4_ = (float)((uint)bVar12 * auVar97._24_4_ | (uint)!bVar12 * auVar105._24_4_);
        bVar12 = SUB81(uVar69 >> 7,0);
        auVar112._28_4_ = (uint)bVar12 * auVar97._28_4_ | (uint)!bVar12 * auVar105._28_4_;
        auVar90 = vxorps_avx512vl(auVar161,auVar161);
        auVar107 = vfmadd213ps_avx512vl(auVar109,auVar109,ZEXT1632(auVar90));
        auVar82 = vfmadd231ps_fma(auVar107,auVar110,auVar110);
        auVar105 = vrsqrt14ps_avx512vl(ZEXT1632(auVar82));
        fVar79 = auVar105._0_4_;
        fVar80 = auVar105._4_4_;
        fVar134 = auVar105._8_4_;
        fVar135 = auVar105._12_4_;
        fVar136 = auVar105._16_4_;
        fVar137 = auVar105._20_4_;
        fVar139 = auVar105._24_4_;
        auVar107._4_4_ = fVar80 * fVar80 * fVar80 * auVar82._4_4_ * -0.5;
        auVar107._0_4_ = fVar79 * fVar79 * fVar79 * auVar82._0_4_ * -0.5;
        auVar107._8_4_ = fVar134 * fVar134 * fVar134 * auVar82._8_4_ * -0.5;
        auVar107._12_4_ = fVar135 * fVar135 * fVar135 * auVar82._12_4_ * -0.5;
        auVar107._16_4_ = fVar136 * fVar136 * fVar136 * -0.0;
        auVar107._20_4_ = fVar137 * fVar137 * fVar137 * -0.0;
        auVar107._24_4_ = fVar139 * fVar139 * fVar139 * -0.0;
        auVar107._28_4_ = 0;
        auVar91 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar107 = vfmadd231ps_avx512vl(auVar107,auVar91,auVar105);
        auVar108._4_4_ = auVar110._4_4_ * auVar107._4_4_;
        auVar108._0_4_ = auVar110._0_4_ * auVar107._0_4_;
        auVar108._8_4_ = auVar110._8_4_ * auVar107._8_4_;
        auVar108._12_4_ = auVar110._12_4_ * auVar107._12_4_;
        auVar108._16_4_ = auVar110._16_4_ * auVar107._16_4_;
        auVar108._20_4_ = auVar110._20_4_ * auVar107._20_4_;
        auVar108._24_4_ = auVar110._24_4_ * auVar107._24_4_;
        auVar108._28_4_ = auVar105._28_4_;
        auVar105._4_4_ = auVar107._4_4_ * -auVar109._4_4_;
        auVar105._0_4_ = auVar107._0_4_ * -auVar109._0_4_;
        auVar105._8_4_ = auVar107._8_4_ * -auVar109._8_4_;
        auVar105._12_4_ = auVar107._12_4_ * -auVar109._12_4_;
        auVar105._16_4_ = auVar107._16_4_ * -fVar158;
        auVar105._20_4_ = auVar107._20_4_ * -fVar165;
        auVar105._24_4_ = auVar107._24_4_ * -fVar157;
        auVar105._28_4_ = uVar70 ^ 0x80000000;
        auVar92 = vmulps_avx512vl(auVar107,ZEXT1632(auVar90));
        auVar96 = ZEXT1632(auVar90);
        auVar104 = vfmadd213ps_avx512vl(auVar111,auVar111,auVar96);
        auVar82 = vfmadd231ps_fma(auVar104,auVar112,auVar112);
        auVar103 = vrsqrt14ps_avx512vl(ZEXT1632(auVar82));
        fVar165 = auVar103._0_4_;
        fVar157 = auVar103._4_4_;
        fVar158 = auVar103._8_4_;
        fVar79 = auVar103._12_4_;
        fVar80 = auVar103._16_4_;
        fVar134 = auVar103._20_4_;
        fVar135 = auVar103._24_4_;
        auVar104._4_4_ = fVar157 * fVar157 * fVar157 * auVar82._4_4_ * -0.5;
        auVar104._0_4_ = fVar165 * fVar165 * fVar165 * auVar82._0_4_ * -0.5;
        auVar104._8_4_ = fVar158 * fVar158 * fVar158 * auVar82._8_4_ * -0.5;
        auVar104._12_4_ = fVar79 * fVar79 * fVar79 * auVar82._12_4_ * -0.5;
        auVar104._16_4_ = fVar80 * fVar80 * fVar80 * -0.0;
        auVar104._20_4_ = fVar134 * fVar134 * fVar134 * -0.0;
        auVar104._24_4_ = fVar135 * fVar135 * fVar135 * -0.0;
        auVar104._28_4_ = 0;
        auVar104 = vfmadd231ps_avx512vl(auVar104,auVar91,auVar103);
        auVar93._4_4_ = auVar112._4_4_ * auVar104._4_4_;
        auVar93._0_4_ = auVar112._0_4_ * auVar104._0_4_;
        auVar93._8_4_ = auVar112._8_4_ * auVar104._8_4_;
        auVar93._12_4_ = auVar112._12_4_ * auVar104._12_4_;
        auVar93._16_4_ = auVar112._16_4_ * auVar104._16_4_;
        auVar93._20_4_ = auVar112._20_4_ * auVar104._20_4_;
        auVar93._24_4_ = auVar112._24_4_ * auVar104._24_4_;
        auVar93._28_4_ = auVar103._28_4_;
        auVar103._4_4_ = -auVar111._4_4_ * auVar104._4_4_;
        auVar103._0_4_ = -auVar111._0_4_ * auVar104._0_4_;
        auVar103._8_4_ = -auVar111._8_4_ * auVar104._8_4_;
        auVar103._12_4_ = -auVar111._12_4_ * auVar104._12_4_;
        auVar103._16_4_ = -fVar188 * auVar104._16_4_;
        auVar103._20_4_ = -fVar172 * auVar104._20_4_;
        auVar103._24_4_ = -fVar159 * auVar104._24_4_;
        auVar103._28_4_ = auVar107._28_4_;
        auVar107 = vmulps_avx512vl(auVar104,auVar96);
        auVar82 = vfmadd213ps_fma(auVar108,auVar99,auVar94);
        auVar89 = vfmadd213ps_fma(auVar105,auVar99,auVar95);
        auVar104 = vfmadd213ps_avx512vl(auVar92,auVar99,auVar106);
        auVar91 = vfmadd213ps_avx512vl(auVar93,auVar100,ZEXT1632(auVar84));
        auVar85 = vfnmadd213ps_fma(auVar108,auVar99,auVar94);
        auVar88 = vfmadd213ps_fma(auVar103,auVar100,ZEXT1632(auVar83));
        auVar144 = vfnmadd213ps_fma(auVar105,auVar99,auVar95);
        auVar87 = vfmadd213ps_fma(auVar107,auVar100,auVar101);
        auVar108 = vfnmadd231ps_avx512vl(auVar106,auVar99,auVar92);
        auVar145 = vfnmadd213ps_fma(auVar93,auVar100,ZEXT1632(auVar84));
        auVar86 = vfnmadd213ps_fma(auVar103,auVar100,ZEXT1632(auVar83));
        auVar160 = vfnmadd231ps_fma(auVar101,auVar100,auVar107);
        auVar105 = vsubps_avx512vl(auVar91,ZEXT1632(auVar85));
        auVar107 = vsubps_avx(ZEXT1632(auVar88),ZEXT1632(auVar144));
        auVar92 = vsubps_avx512vl(ZEXT1632(auVar87),auVar108);
        auVar93 = vmulps_avx512vl(auVar107,auVar108);
        auVar84 = vfmsub231ps_fma(auVar93,ZEXT1632(auVar144),auVar92);
        auVar94._4_4_ = auVar85._4_4_ * auVar92._4_4_;
        auVar94._0_4_ = auVar85._0_4_ * auVar92._0_4_;
        auVar94._8_4_ = auVar85._8_4_ * auVar92._8_4_;
        auVar94._12_4_ = auVar85._12_4_ * auVar92._12_4_;
        auVar94._16_4_ = auVar92._16_4_ * 0.0;
        auVar94._20_4_ = auVar92._20_4_ * 0.0;
        auVar94._24_4_ = auVar92._24_4_ * 0.0;
        auVar94._28_4_ = auVar92._28_4_;
        auVar92 = vfmsub231ps_avx512vl(auVar94,auVar108,auVar105);
        auVar95._4_4_ = auVar144._4_4_ * auVar105._4_4_;
        auVar95._0_4_ = auVar144._0_4_ * auVar105._0_4_;
        auVar95._8_4_ = auVar144._8_4_ * auVar105._8_4_;
        auVar95._12_4_ = auVar144._12_4_ * auVar105._12_4_;
        auVar95._16_4_ = auVar105._16_4_ * 0.0;
        auVar95._20_4_ = auVar105._20_4_ * 0.0;
        auVar95._24_4_ = auVar105._24_4_ * 0.0;
        auVar95._28_4_ = auVar105._28_4_;
        auVar83 = vfmsub231ps_fma(auVar95,ZEXT1632(auVar85),auVar107);
        auVar107 = vfmadd231ps_avx512vl(ZEXT1632(auVar83),auVar96,auVar92);
        auVar107 = vfmadd231ps_avx512vl(auVar107,auVar96,ZEXT1632(auVar84));
        auVar101 = ZEXT1632(auVar90);
        uVar69 = vcmpps_avx512vl(auVar107,auVar101,2);
        bVar68 = (byte)uVar69;
        fVar79 = (float)((uint)(bVar68 & 1) * auVar82._0_4_ |
                        (uint)!(bool)(bVar68 & 1) * auVar145._0_4_);
        bVar12 = (bool)((byte)(uVar69 >> 1) & 1);
        fVar134 = (float)((uint)bVar12 * auVar82._4_4_ | (uint)!bVar12 * auVar145._4_4_);
        bVar12 = (bool)((byte)(uVar69 >> 2) & 1);
        fVar136 = (float)((uint)bVar12 * auVar82._8_4_ | (uint)!bVar12 * auVar145._8_4_);
        bVar12 = (bool)((byte)(uVar69 >> 3) & 1);
        fVar139 = (float)((uint)bVar12 * auVar82._12_4_ | (uint)!bVar12 * auVar145._12_4_);
        auVar93 = ZEXT1632(CONCAT412(fVar139,CONCAT48(fVar136,CONCAT44(fVar134,fVar79))));
        fVar80 = (float)((uint)(bVar68 & 1) * auVar89._0_4_ |
                        (uint)!(bool)(bVar68 & 1) * auVar86._0_4_);
        bVar12 = (bool)((byte)(uVar69 >> 1) & 1);
        fVar135 = (float)((uint)bVar12 * auVar89._4_4_ | (uint)!bVar12 * auVar86._4_4_);
        bVar12 = (bool)((byte)(uVar69 >> 2) & 1);
        fVar137 = (float)((uint)bVar12 * auVar89._8_4_ | (uint)!bVar12 * auVar86._8_4_);
        bVar12 = (bool)((byte)(uVar69 >> 3) & 1);
        fVar140 = (float)((uint)bVar12 * auVar89._12_4_ | (uint)!bVar12 * auVar86._12_4_);
        auVar103 = ZEXT1632(CONCAT412(fVar140,CONCAT48(fVar137,CONCAT44(fVar135,fVar80))));
        auVar113._0_4_ =
             (float)((uint)(bVar68 & 1) * auVar104._0_4_ |
                    (uint)!(bool)(bVar68 & 1) * auVar160._0_4_);
        bVar12 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar113._4_4_ = (float)((uint)bVar12 * auVar104._4_4_ | (uint)!bVar12 * auVar160._4_4_);
        bVar12 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar113._8_4_ = (float)((uint)bVar12 * auVar104._8_4_ | (uint)!bVar12 * auVar160._8_4_);
        bVar12 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar113._12_4_ = (float)((uint)bVar12 * auVar104._12_4_ | (uint)!bVar12 * auVar160._12_4_);
        fVar158 = (float)((uint)((byte)(uVar69 >> 4) & 1) * auVar104._16_4_);
        auVar113._16_4_ = fVar158;
        fVar157 = (float)((uint)((byte)(uVar69 >> 5) & 1) * auVar104._20_4_);
        auVar113._20_4_ = fVar157;
        fVar165 = (float)((uint)((byte)(uVar69 >> 6) & 1) * auVar104._24_4_);
        auVar113._24_4_ = fVar165;
        iVar1 = (uint)(byte)(uVar69 >> 7) * auVar104._28_4_;
        auVar113._28_4_ = iVar1;
        auVar105 = vblendmps_avx512vl(ZEXT1632(auVar85),auVar91);
        auVar114._0_4_ =
             (uint)(bVar68 & 1) * auVar105._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar84._0_4_;
        bVar12 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar114._4_4_ = (uint)bVar12 * auVar105._4_4_ | (uint)!bVar12 * auVar84._4_4_;
        bVar12 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar114._8_4_ = (uint)bVar12 * auVar105._8_4_ | (uint)!bVar12 * auVar84._8_4_;
        bVar12 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar114._12_4_ = (uint)bVar12 * auVar105._12_4_ | (uint)!bVar12 * auVar84._12_4_;
        auVar114._16_4_ = (uint)((byte)(uVar69 >> 4) & 1) * auVar105._16_4_;
        auVar114._20_4_ = (uint)((byte)(uVar69 >> 5) & 1) * auVar105._20_4_;
        auVar114._24_4_ = (uint)((byte)(uVar69 >> 6) & 1) * auVar105._24_4_;
        auVar114._28_4_ = (uint)(byte)(uVar69 >> 7) * auVar105._28_4_;
        auVar105 = vblendmps_avx512vl(ZEXT1632(auVar144),ZEXT1632(auVar88));
        auVar115._0_4_ =
             (float)((uint)(bVar68 & 1) * auVar105._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar89._0_4_
                    );
        bVar12 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar115._4_4_ = (float)((uint)bVar12 * auVar105._4_4_ | (uint)!bVar12 * auVar89._4_4_);
        bVar12 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar115._8_4_ = (float)((uint)bVar12 * auVar105._8_4_ | (uint)!bVar12 * auVar89._8_4_);
        bVar12 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar115._12_4_ = (float)((uint)bVar12 * auVar105._12_4_ | (uint)!bVar12 * auVar89._12_4_);
        fVar172 = (float)((uint)((byte)(uVar69 >> 4) & 1) * auVar105._16_4_);
        auVar115._16_4_ = fVar172;
        fVar159 = (float)((uint)((byte)(uVar69 >> 5) & 1) * auVar105._20_4_);
        auVar115._20_4_ = fVar159;
        fVar188 = (float)((uint)((byte)(uVar69 >> 6) & 1) * auVar105._24_4_);
        auVar115._24_4_ = fVar188;
        auVar115._28_4_ = (uint)(byte)(uVar69 >> 7) * auVar105._28_4_;
        auVar105 = vblendmps_avx512vl(auVar108,ZEXT1632(auVar87));
        auVar116._0_4_ =
             (float)((uint)(bVar68 & 1) * auVar105._0_4_ |
                    (uint)!(bool)(bVar68 & 1) * auVar104._0_4_);
        bVar12 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar116._4_4_ = (float)((uint)bVar12 * auVar105._4_4_ | (uint)!bVar12 * auVar104._4_4_);
        bVar12 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar116._8_4_ = (float)((uint)bVar12 * auVar105._8_4_ | (uint)!bVar12 * auVar104._8_4_);
        bVar12 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar116._12_4_ = (float)((uint)bVar12 * auVar105._12_4_ | (uint)!bVar12 * auVar104._12_4_);
        bVar12 = (bool)((byte)(uVar69 >> 4) & 1);
        auVar116._16_4_ = (float)((uint)bVar12 * auVar105._16_4_ | (uint)!bVar12 * auVar104._16_4_);
        bVar12 = (bool)((byte)(uVar69 >> 5) & 1);
        auVar116._20_4_ = (float)((uint)bVar12 * auVar105._20_4_ | (uint)!bVar12 * auVar104._20_4_);
        bVar12 = (bool)((byte)(uVar69 >> 6) & 1);
        auVar116._24_4_ = (float)((uint)bVar12 * auVar105._24_4_ | (uint)!bVar12 * auVar104._24_4_);
        bVar12 = SUB81(uVar69 >> 7,0);
        auVar116._28_4_ = (uint)bVar12 * auVar105._28_4_ | (uint)!bVar12 * auVar104._28_4_;
        auVar117._0_4_ =
             (uint)(bVar68 & 1) * (int)auVar85._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar91._0_4_;
        bVar12 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar117._4_4_ = (uint)bVar12 * (int)auVar85._4_4_ | (uint)!bVar12 * auVar91._4_4_;
        bVar12 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar117._8_4_ = (uint)bVar12 * (int)auVar85._8_4_ | (uint)!bVar12 * auVar91._8_4_;
        bVar12 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar117._12_4_ = (uint)bVar12 * (int)auVar85._12_4_ | (uint)!bVar12 * auVar91._12_4_;
        auVar117._16_4_ = (uint)!(bool)((byte)(uVar69 >> 4) & 1) * auVar91._16_4_;
        auVar117._20_4_ = (uint)!(bool)((byte)(uVar69 >> 5) & 1) * auVar91._20_4_;
        auVar117._24_4_ = (uint)!(bool)((byte)(uVar69 >> 6) & 1) * auVar91._24_4_;
        auVar117._28_4_ = (uint)!SUB81(uVar69 >> 7,0) * auVar91._28_4_;
        bVar12 = (bool)((byte)(uVar69 >> 1) & 1);
        bVar14 = (bool)((byte)(uVar69 >> 2) & 1);
        bVar15 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar118._0_4_ =
             (uint)(bVar68 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar87._0_4_;
        bVar13 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar118._4_4_ = (uint)bVar13 * auVar108._4_4_ | (uint)!bVar13 * auVar87._4_4_;
        bVar13 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar118._8_4_ = (uint)bVar13 * auVar108._8_4_ | (uint)!bVar13 * auVar87._8_4_;
        bVar13 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar118._12_4_ = (uint)bVar13 * auVar108._12_4_ | (uint)!bVar13 * auVar87._12_4_;
        auVar118._16_4_ = (uint)((byte)(uVar69 >> 4) & 1) * auVar108._16_4_;
        auVar118._20_4_ = (uint)((byte)(uVar69 >> 5) & 1) * auVar108._20_4_;
        auVar118._24_4_ = (uint)((byte)(uVar69 >> 6) & 1) * auVar108._24_4_;
        iVar2 = (uint)(byte)(uVar69 >> 7) * auVar108._28_4_;
        auVar118._28_4_ = iVar2;
        auVar94 = vsubps_avx512vl(auVar117,auVar93);
        auVar108 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar15 * (int)auVar144._12_4_ |
                                                 (uint)!bVar15 * auVar88._12_4_,
                                                 CONCAT48((uint)bVar14 * (int)auVar144._8_4_ |
                                                          (uint)!bVar14 * auVar88._8_4_,
                                                          CONCAT44((uint)bVar12 *
                                                                   (int)auVar144._4_4_ |
                                                                   (uint)!bVar12 * auVar88._4_4_,
                                                                   (uint)(bVar68 & 1) *
                                                                   (int)auVar144._0_4_ |
                                                                   (uint)!(bool)(bVar68 & 1) *
                                                                   auVar88._0_4_)))),auVar103);
        auVar206 = ZEXT3264(auVar108);
        auVar105 = vsubps_avx(auVar118,auVar113);
        auVar104 = vsubps_avx(auVar93,auVar114);
        auVar211 = ZEXT3264(auVar104);
        auVar91 = vsubps_avx(auVar103,auVar115);
        auVar92 = vsubps_avx(auVar113,auVar116);
        auVar96._4_4_ = auVar105._4_4_ * fVar134;
        auVar96._0_4_ = auVar105._0_4_ * fVar79;
        auVar96._8_4_ = auVar105._8_4_ * fVar136;
        auVar96._12_4_ = auVar105._12_4_ * fVar139;
        auVar96._16_4_ = auVar105._16_4_ * 0.0;
        auVar96._20_4_ = auVar105._20_4_ * 0.0;
        auVar96._24_4_ = auVar105._24_4_ * 0.0;
        auVar96._28_4_ = iVar2;
        auVar82 = vfmsub231ps_fma(auVar96,auVar113,auVar94);
        auVar97._4_4_ = fVar135 * auVar94._4_4_;
        auVar97._0_4_ = fVar80 * auVar94._0_4_;
        auVar97._8_4_ = fVar137 * auVar94._8_4_;
        auVar97._12_4_ = fVar140 * auVar94._12_4_;
        auVar97._16_4_ = auVar94._16_4_ * 0.0;
        auVar97._20_4_ = auVar94._20_4_ * 0.0;
        auVar97._24_4_ = auVar94._24_4_ * 0.0;
        auVar97._28_4_ = auVar107._28_4_;
        auVar89 = vfmsub231ps_fma(auVar97,auVar93,auVar108);
        auVar107 = vfmadd231ps_avx512vl(ZEXT1632(auVar89),auVar101,ZEXT1632(auVar82));
        auVar191._0_4_ = auVar108._0_4_ * auVar113._0_4_;
        auVar191._4_4_ = auVar108._4_4_ * auVar113._4_4_;
        auVar191._8_4_ = auVar108._8_4_ * auVar113._8_4_;
        auVar191._12_4_ = auVar108._12_4_ * auVar113._12_4_;
        auVar191._16_4_ = auVar108._16_4_ * fVar158;
        auVar191._20_4_ = auVar108._20_4_ * fVar157;
        auVar191._24_4_ = auVar108._24_4_ * fVar165;
        auVar191._28_4_ = 0;
        auVar82 = vfmsub231ps_fma(auVar191,auVar103,auVar105);
        auVar95 = vfmadd231ps_avx512vl(auVar107,auVar101,ZEXT1632(auVar82));
        auVar107 = vmulps_avx512vl(auVar92,auVar114);
        auVar107 = vfmsub231ps_avx512vl(auVar107,auVar104,auVar116);
        auVar106._4_4_ = auVar91._4_4_ * auVar116._4_4_;
        auVar106._0_4_ = auVar91._0_4_ * auVar116._0_4_;
        auVar106._8_4_ = auVar91._8_4_ * auVar116._8_4_;
        auVar106._12_4_ = auVar91._12_4_ * auVar116._12_4_;
        auVar106._16_4_ = auVar91._16_4_ * auVar116._16_4_;
        auVar106._20_4_ = auVar91._20_4_ * auVar116._20_4_;
        auVar106._24_4_ = auVar91._24_4_ * auVar116._24_4_;
        auVar106._28_4_ = auVar116._28_4_;
        auVar82 = vfmsub231ps_fma(auVar106,auVar115,auVar92);
        auVar192._0_4_ = auVar115._0_4_ * auVar104._0_4_;
        auVar192._4_4_ = auVar115._4_4_ * auVar104._4_4_;
        auVar192._8_4_ = auVar115._8_4_ * auVar104._8_4_;
        auVar192._12_4_ = auVar115._12_4_ * auVar104._12_4_;
        auVar192._16_4_ = fVar172 * auVar104._16_4_;
        auVar192._20_4_ = fVar159 * auVar104._20_4_;
        auVar192._24_4_ = fVar188 * auVar104._24_4_;
        auVar192._28_4_ = 0;
        auVar89 = vfmsub231ps_fma(auVar192,auVar91,auVar114);
        auVar107 = vfmadd231ps_avx512vl(ZEXT1632(auVar89),auVar101,auVar107);
        auVar96 = vfmadd231ps_avx512vl(auVar107,auVar101,ZEXT1632(auVar82));
        auVar196 = ZEXT3264(auVar96);
        auVar107 = vmaxps_avx(auVar95,auVar96);
        uVar25 = vcmpps_avx512vl(auVar107,auVar101,2);
        bVar78 = bVar78 & (byte)uVar25;
        if (bVar78 != 0) {
          uVar143 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar224._4_4_ = uVar143;
          auVar224._0_4_ = uVar143;
          auVar224._8_4_ = uVar143;
          auVar224._12_4_ = uVar143;
          auVar224._16_4_ = uVar143;
          auVar224._20_4_ = uVar143;
          auVar224._24_4_ = uVar143;
          auVar224._28_4_ = uVar143;
          auVar227 = ZEXT3264(auVar224);
          auVar34._4_4_ = auVar92._4_4_ * auVar108._4_4_;
          auVar34._0_4_ = auVar92._0_4_ * auVar108._0_4_;
          auVar34._8_4_ = auVar92._8_4_ * auVar108._8_4_;
          auVar34._12_4_ = auVar92._12_4_ * auVar108._12_4_;
          auVar34._16_4_ = auVar92._16_4_ * auVar108._16_4_;
          auVar34._20_4_ = auVar92._20_4_ * auVar108._20_4_;
          auVar34._24_4_ = auVar92._24_4_ * auVar108._24_4_;
          auVar34._28_4_ = auVar107._28_4_;
          auVar84 = vfmsub231ps_fma(auVar34,auVar91,auVar105);
          auVar35._4_4_ = auVar105._4_4_ * auVar104._4_4_;
          auVar35._0_4_ = auVar105._0_4_ * auVar104._0_4_;
          auVar35._8_4_ = auVar105._8_4_ * auVar104._8_4_;
          auVar35._12_4_ = auVar105._12_4_ * auVar104._12_4_;
          auVar35._16_4_ = auVar105._16_4_ * auVar104._16_4_;
          auVar35._20_4_ = auVar105._20_4_ * auVar104._20_4_;
          auVar35._24_4_ = auVar105._24_4_ * auVar104._24_4_;
          auVar35._28_4_ = auVar105._28_4_;
          auVar88 = vfmsub231ps_fma(auVar35,auVar94,auVar92);
          auVar36._4_4_ = auVar91._4_4_ * auVar94._4_4_;
          auVar36._0_4_ = auVar91._0_4_ * auVar94._0_4_;
          auVar36._8_4_ = auVar91._8_4_ * auVar94._8_4_;
          auVar36._12_4_ = auVar91._12_4_ * auVar94._12_4_;
          auVar36._16_4_ = auVar91._16_4_ * auVar94._16_4_;
          auVar36._20_4_ = auVar91._20_4_ * auVar94._20_4_;
          auVar36._24_4_ = auVar91._24_4_ * auVar94._24_4_;
          auVar36._28_4_ = auVar91._28_4_;
          auVar83 = vfmsub231ps_fma(auVar36,auVar104,auVar108);
          auVar82 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar88),ZEXT1632(auVar83));
          auVar89 = vfmadd231ps_fma(ZEXT1632(auVar82),ZEXT1632(auVar84),ZEXT1232(ZEXT412(0)) << 0x20
                                   );
          auVar107 = vrcp14ps_avx512vl(ZEXT1632(auVar89));
          auVar211 = ZEXT3264(auVar107);
          auVar30._8_4_ = 0x3f800000;
          auVar30._0_8_ = 0x3f8000003f800000;
          auVar30._12_4_ = 0x3f800000;
          auVar30._16_4_ = 0x3f800000;
          auVar30._20_4_ = 0x3f800000;
          auVar30._24_4_ = 0x3f800000;
          auVar30._28_4_ = 0x3f800000;
          auVar108 = vfnmadd213ps_avx512vl(auVar107,ZEXT1632(auVar89),auVar30);
          auVar82 = vfmadd132ps_fma(auVar108,auVar107,auVar107);
          auVar206 = ZEXT1664(auVar82);
          auVar37._4_4_ = auVar83._4_4_ * auVar113._4_4_;
          auVar37._0_4_ = auVar83._0_4_ * auVar113._0_4_;
          auVar37._8_4_ = auVar83._8_4_ * auVar113._8_4_;
          auVar37._12_4_ = auVar83._12_4_ * auVar113._12_4_;
          auVar37._16_4_ = fVar158 * 0.0;
          auVar37._20_4_ = fVar157 * 0.0;
          auVar37._24_4_ = fVar165 * 0.0;
          auVar37._28_4_ = iVar1;
          auVar88 = vfmadd231ps_fma(auVar37,auVar103,ZEXT1632(auVar88));
          auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar93,ZEXT1632(auVar84));
          fVar165 = auVar82._0_4_;
          fVar157 = auVar82._4_4_;
          fVar158 = auVar82._8_4_;
          fVar159 = auVar82._12_4_;
          local_360 = ZEXT1632(CONCAT412(auVar88._12_4_ * fVar159,
                                         CONCAT48(auVar88._8_4_ * fVar158,
                                                  CONCAT44(auVar88._4_4_ * fVar157,
                                                           auVar88._0_4_ * fVar165))));
          auVar217 = ZEXT3264(local_360);
          auVar149._4_4_ = local_4e0;
          auVar149._0_4_ = local_4e0;
          auVar149._8_4_ = local_4e0;
          auVar149._12_4_ = local_4e0;
          auVar149._16_4_ = local_4e0;
          auVar149._20_4_ = local_4e0;
          auVar149._24_4_ = local_4e0;
          auVar149._28_4_ = local_4e0;
          uVar25 = vcmpps_avx512vl(local_360,auVar224,2);
          uVar26 = vcmpps_avx512vl(auVar149,local_360,2);
          bVar78 = (byte)uVar25 & (byte)uVar26 & bVar78;
          if (bVar78 != 0) {
            uVar73 = vcmpps_avx512vl(ZEXT1632(auVar89),ZEXT1232(ZEXT412(0)) << 0x20,4);
            uVar73 = bVar78 & uVar73;
            if ((char)uVar73 != '\0') {
              fVar172 = auVar95._0_4_ * fVar165;
              fVar188 = auVar95._4_4_ * fVar157;
              auVar38._4_4_ = fVar188;
              auVar38._0_4_ = fVar172;
              fVar79 = auVar95._8_4_ * fVar158;
              auVar38._8_4_ = fVar79;
              fVar80 = auVar95._12_4_ * fVar159;
              auVar38._12_4_ = fVar80;
              fVar134 = auVar95._16_4_ * 0.0;
              auVar38._16_4_ = fVar134;
              fVar135 = auVar95._20_4_ * 0.0;
              auVar38._20_4_ = fVar135;
              fVar136 = auVar95._24_4_ * 0.0;
              auVar38._24_4_ = fVar136;
              auVar38._28_4_ = auVar95._28_4_;
              auVar150._8_4_ = 0x3f800000;
              auVar150._0_8_ = 0x3f8000003f800000;
              auVar150._12_4_ = 0x3f800000;
              auVar150._16_4_ = 0x3f800000;
              auVar150._20_4_ = 0x3f800000;
              auVar150._24_4_ = 0x3f800000;
              auVar150._28_4_ = 0x3f800000;
              auVar107 = vsubps_avx(auVar150,auVar38);
              local_3a0._0_4_ =
                   (float)((uint)(bVar68 & 1) * (int)fVar172 |
                          (uint)!(bool)(bVar68 & 1) * auVar107._0_4_);
              bVar12 = (bool)((byte)(uVar69 >> 1) & 1);
              local_3a0._4_4_ =
                   (float)((uint)bVar12 * (int)fVar188 | (uint)!bVar12 * auVar107._4_4_);
              bVar12 = (bool)((byte)(uVar69 >> 2) & 1);
              local_3a0._8_4_ = (float)((uint)bVar12 * (int)fVar79 | (uint)!bVar12 * auVar107._8_4_)
              ;
              bVar12 = (bool)((byte)(uVar69 >> 3) & 1);
              local_3a0._12_4_ =
                   (float)((uint)bVar12 * (int)fVar80 | (uint)!bVar12 * auVar107._12_4_);
              bVar12 = (bool)((byte)(uVar69 >> 4) & 1);
              local_3a0._16_4_ =
                   (float)((uint)bVar12 * (int)fVar134 | (uint)!bVar12 * auVar107._16_4_);
              bVar12 = (bool)((byte)(uVar69 >> 5) & 1);
              local_3a0._20_4_ =
                   (float)((uint)bVar12 * (int)fVar135 | (uint)!bVar12 * auVar107._20_4_);
              bVar12 = (bool)((byte)(uVar69 >> 6) & 1);
              local_3a0._24_4_ =
                   (float)((uint)bVar12 * (int)fVar136 | (uint)!bVar12 * auVar107._24_4_);
              bVar12 = SUB81(uVar69 >> 7,0);
              local_3a0._28_4_ =
                   (float)((uint)bVar12 * auVar95._28_4_ | (uint)!bVar12 * auVar107._28_4_);
              auVar107 = vsubps_avx(auVar100,auVar99);
              auVar82 = vfmadd213ps_fma(auVar107,local_3a0,auVar99);
              uVar143 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
              auVar99._4_4_ = uVar143;
              auVar99._0_4_ = uVar143;
              auVar99._8_4_ = uVar143;
              auVar99._12_4_ = uVar143;
              auVar99._16_4_ = uVar143;
              auVar99._20_4_ = uVar143;
              auVar99._24_4_ = uVar143;
              auVar99._28_4_ = uVar143;
              auVar107 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar82._12_4_ + auVar82._12_4_,
                                                            CONCAT48(auVar82._8_4_ + auVar82._8_4_,
                                                                     CONCAT44(auVar82._4_4_ +
                                                                              auVar82._4_4_,
                                                                              auVar82._0_4_ +
                                                                              auVar82._0_4_)))),
                                         auVar99);
              uVar27 = vcmpps_avx512vl(local_360,auVar107,6);
              uVar73 = uVar73 & uVar27;
              bVar78 = (byte)uVar73;
              if (bVar78 != 0) {
                auVar170._0_4_ = auVar96._0_4_ * fVar165;
                auVar170._4_4_ = auVar96._4_4_ * fVar157;
                auVar170._8_4_ = auVar96._8_4_ * fVar158;
                auVar170._12_4_ = auVar96._12_4_ * fVar159;
                auVar170._16_4_ = auVar96._16_4_ * 0.0;
                auVar170._20_4_ = auVar96._20_4_ * 0.0;
                auVar170._24_4_ = auVar96._24_4_ * 0.0;
                auVar170._28_4_ = 0;
                auVar185._8_4_ = 0x3f800000;
                auVar185._0_8_ = 0x3f8000003f800000;
                auVar185._12_4_ = 0x3f800000;
                auVar185._16_4_ = 0x3f800000;
                auVar185._20_4_ = 0x3f800000;
                auVar185._24_4_ = 0x3f800000;
                auVar185._28_4_ = 0x3f800000;
                auVar107 = vsubps_avx(auVar185,auVar170);
                auVar119._0_4_ =
                     (uint)(bVar68 & 1) * (int)auVar170._0_4_ |
                     (uint)!(bool)(bVar68 & 1) * auVar107._0_4_;
                bVar12 = (bool)((byte)(uVar69 >> 1) & 1);
                auVar119._4_4_ = (uint)bVar12 * (int)auVar170._4_4_ | (uint)!bVar12 * auVar107._4_4_
                ;
                bVar12 = (bool)((byte)(uVar69 >> 2) & 1);
                auVar119._8_4_ = (uint)bVar12 * (int)auVar170._8_4_ | (uint)!bVar12 * auVar107._8_4_
                ;
                bVar12 = (bool)((byte)(uVar69 >> 3) & 1);
                auVar119._12_4_ =
                     (uint)bVar12 * (int)auVar170._12_4_ | (uint)!bVar12 * auVar107._12_4_;
                bVar12 = (bool)((byte)(uVar69 >> 4) & 1);
                auVar119._16_4_ =
                     (uint)bVar12 * (int)auVar170._16_4_ | (uint)!bVar12 * auVar107._16_4_;
                bVar12 = (bool)((byte)(uVar69 >> 5) & 1);
                auVar119._20_4_ =
                     (uint)bVar12 * (int)auVar170._20_4_ | (uint)!bVar12 * auVar107._20_4_;
                bVar12 = (bool)((byte)(uVar69 >> 6) & 1);
                auVar119._24_4_ =
                     (uint)bVar12 * (int)auVar170._24_4_ | (uint)!bVar12 * auVar107._24_4_;
                auVar119._28_4_ = (uint)!SUB81(uVar69 >> 7,0) * auVar107._28_4_;
                auVar100._8_4_ = 0x40000000;
                auVar100._0_8_ = 0x4000000040000000;
                auVar100._12_4_ = 0x40000000;
                auVar100._16_4_ = 0x40000000;
                auVar100._20_4_ = 0x40000000;
                auVar100._24_4_ = 0x40000000;
                auVar100._28_4_ = 0x40000000;
                local_380 = vfmsub132ps_avx512vl(auVar119,auVar185,auVar100);
                local_340 = 0;
                if ((pGVar76->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                  fVar165 = 1.0 / auVar102._0_4_;
                  local_2e0[0] = fVar165 * (local_3a0._0_4_ + 0.0);
                  local_2e0[1] = fVar165 * (local_3a0._4_4_ + 1.0);
                  local_2e0[2] = fVar165 * (local_3a0._8_4_ + 2.0);
                  local_2e0[3] = fVar165 * (local_3a0._12_4_ + 3.0);
                  fStack_2d0 = fVar165 * (local_3a0._16_4_ + 4.0);
                  fStack_2cc = fVar165 * (local_3a0._20_4_ + 5.0);
                  fStack_2c8 = fVar165 * (local_3a0._24_4_ + 6.0);
                  fStack_2c4 = local_3a0._28_4_ + 7.0;
                  local_2c0 = local_380;
                  local_2a0 = local_360;
                  auVar151._8_4_ = 0x7f800000;
                  auVar151._0_8_ = 0x7f8000007f800000;
                  auVar151._12_4_ = 0x7f800000;
                  auVar151._16_4_ = 0x7f800000;
                  auVar151._20_4_ = 0x7f800000;
                  auVar151._24_4_ = 0x7f800000;
                  auVar151._28_4_ = 0x7f800000;
                  auVar107 = vblendmps_avx512vl(auVar151,local_360);
                  auVar120._0_4_ =
                       (uint)(bVar78 & 1) * auVar107._0_4_ | (uint)!(bool)(bVar78 & 1) * 0x7f800000;
                  bVar12 = (bool)((byte)(uVar73 >> 1) & 1);
                  auVar120._4_4_ = (uint)bVar12 * auVar107._4_4_ | (uint)!bVar12 * 0x7f800000;
                  bVar12 = (bool)((byte)(uVar73 >> 2) & 1);
                  auVar120._8_4_ = (uint)bVar12 * auVar107._8_4_ | (uint)!bVar12 * 0x7f800000;
                  bVar12 = (bool)((byte)(uVar73 >> 3) & 1);
                  auVar120._12_4_ = (uint)bVar12 * auVar107._12_4_ | (uint)!bVar12 * 0x7f800000;
                  bVar12 = (bool)((byte)(uVar73 >> 4) & 1);
                  auVar120._16_4_ = (uint)bVar12 * auVar107._16_4_ | (uint)!bVar12 * 0x7f800000;
                  bVar12 = (bool)((byte)(uVar73 >> 5) & 1);
                  auVar120._20_4_ = (uint)bVar12 * auVar107._20_4_ | (uint)!bVar12 * 0x7f800000;
                  bVar12 = (bool)((byte)(uVar73 >> 6) & 1);
                  auVar120._24_4_ = (uint)bVar12 * auVar107._24_4_ | (uint)!bVar12 * 0x7f800000;
                  bVar12 = SUB81(uVar73 >> 7,0);
                  auVar120._28_4_ = (uint)bVar12 * auVar107._28_4_ | (uint)!bVar12 * 0x7f800000;
                  auVar107 = vshufps_avx(auVar120,auVar120,0xb1);
                  auVar107 = vminps_avx(auVar120,auVar107);
                  auVar108 = vshufpd_avx(auVar107,auVar107,5);
                  auVar107 = vminps_avx(auVar107,auVar108);
                  auVar108 = vpermpd_avx2(auVar107,0x4e);
                  auVar107 = vminps_avx(auVar107,auVar108);
                  uVar25 = vcmpps_avx512vl(auVar120,auVar107,0);
                  uVar70 = (uint)uVar73;
                  if (((byte)uVar25 & bVar78) != 0) {
                    uVar70 = (uint)((byte)uVar25 & bVar78);
                  }
                  uVar71 = 0;
                  for (; (uVar70 & 1) == 0; uVar70 = uVar70 >> 1 | 0x80000000) {
                    uVar71 = uVar71 + 1;
                  }
                  uVar69 = (ulong)uVar71;
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (pGVar76->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                    local_4c0 = vpbroadcastd_avx512vl();
                    local_540 = vpbroadcastd_avx512vl();
                    local_600 = auVar98;
                    local_5c0 = local_360;
                    local_5a0 = pGVar76;
                    local_33c = iVar72;
                    local_330 = auVar81;
                    local_320 = uVar24;
                    uStack_318 = uVar61;
                    local_310 = uVar62;
                    uStack_308 = uVar63;
                    local_300 = uVar64;
                    uStack_2f8 = uVar65;
                    do {
                      fVar165 = local_2e0[uVar69];
                      auVar163._4_4_ = fVar165;
                      auVar163._0_4_ = fVar165;
                      auVar163._8_4_ = fVar165;
                      auVar163._12_4_ = fVar165;
                      local_1c0._16_4_ = fVar165;
                      local_1c0._0_16_ = auVar163;
                      local_1c0._20_4_ = fVar165;
                      local_1c0._24_4_ = fVar165;
                      local_1c0._28_4_ = fVar165;
                      local_1a0 = *(undefined4 *)(local_2c0 + uVar69 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2a0 + uVar69 * 4)
                      ;
                      local_678.context = context->user;
                      fVar157 = 1.0 - fVar165;
                      auVar84 = vfnmadd231ss_fma(ZEXT416((uint)(fVar165 * (fVar157 + fVar157))),
                                                 ZEXT416((uint)fVar157),ZEXT416((uint)fVar157));
                      auVar82 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar163,
                                                ZEXT416(0xc0a00000));
                      auVar89 = vfmadd231ss_fma(ZEXT416((uint)(fVar165 * fVar165 * 3.0)),
                                                ZEXT416((uint)(fVar165 + fVar165)),auVar82);
                      auVar211 = ZEXT1664(auVar89);
                      auVar82 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar163,
                                                ZEXT416(0x40000000));
                      auVar82 = vfmadd231ss_fma(ZEXT416((uint)(fVar157 * fVar157 * -3.0)),
                                                ZEXT416((uint)(fVar157 + fVar157)),auVar82);
                      auVar88 = vfmadd231ss_fma(ZEXT416((uint)(fVar165 * fVar165)),auVar163,
                                                ZEXT416((uint)(fVar157 * -2.0)));
                      fVar165 = auVar84._0_4_ * 0.5;
                      fVar157 = auVar89._0_4_ * 0.5;
                      fVar158 = auVar82._0_4_ * 0.5;
                      fVar159 = auVar88._0_4_ * 0.5;
                      auVar183._0_4_ = fVar159 * local_6c0;
                      auVar183._4_4_ = fVar159 * fStack_6bc;
                      auVar183._8_4_ = fVar159 * fStack_6b8;
                      auVar183._12_4_ = fVar159 * fStack_6b4;
                      auVar202._4_4_ = fVar158;
                      auVar202._0_4_ = fVar158;
                      auVar202._8_4_ = fVar158;
                      auVar202._12_4_ = fVar158;
                      auVar82 = vfmadd132ps_fma(auVar202,auVar183,auVar146);
                      auVar184._4_4_ = fVar157;
                      auVar184._0_4_ = fVar157;
                      auVar184._8_4_ = fVar157;
                      auVar184._12_4_ = fVar157;
                      auVar82 = vfmadd132ps_fma(auVar184,auVar82,auVar19);
                      auVar148._4_4_ = fVar165;
                      auVar148._0_4_ = fVar165;
                      auVar148._8_4_ = fVar165;
                      auVar148._12_4_ = fVar165;
                      auVar82 = vfmadd213ps_fma(auVar148,auVar81,auVar82);
                      local_220 = auVar82._0_4_;
                      auVar98._8_4_ = 1;
                      auVar98._0_8_ = 0x100000001;
                      auVar98._12_4_ = 1;
                      auVar98._16_4_ = 1;
                      auVar98._20_4_ = 1;
                      auVar98._24_4_ = 1;
                      auVar98._28_4_ = 1;
                      local_200 = vpermps_avx2(auVar98,ZEXT1632(auVar82));
                      auVar196 = ZEXT3264(local_200);
                      auVar203._8_4_ = 2;
                      auVar203._0_8_ = 0x200000002;
                      auVar203._12_4_ = 2;
                      auVar205._16_4_ = 2;
                      auVar205._0_16_ = auVar203;
                      auVar205._20_4_ = 2;
                      auVar205._24_4_ = 2;
                      auVar205._28_4_ = 2;
                      auVar206 = ZEXT3264(auVar205);
                      local_1e0 = vpermps_avx2(auVar205,ZEXT1632(auVar82));
                      iStack_21c = local_220;
                      iStack_218 = local_220;
                      iStack_214 = local_220;
                      iStack_210 = local_220;
                      iStack_20c = local_220;
                      iStack_208 = local_220;
                      iStack_204 = local_220;
                      uStack_19c = local_1a0;
                      uStack_198 = local_1a0;
                      uStack_194 = local_1a0;
                      uStack_190 = local_1a0;
                      uStack_18c = local_1a0;
                      uStack_188 = local_1a0;
                      uStack_184 = local_1a0;
                      local_180 = local_540._0_8_;
                      uStack_178 = local_540._8_8_;
                      uStack_170 = local_540._16_8_;
                      uStack_168 = local_540._24_8_;
                      local_160 = local_4c0;
                      auVar107 = vpcmpeqd_avx2(local_4c0,local_4c0);
                      local_648[1] = auVar107;
                      *local_648 = auVar107;
                      local_140 = (local_678.context)->instID[0];
                      uStack_13c = local_140;
                      uStack_138 = local_140;
                      uStack_134 = local_140;
                      uStack_130 = local_140;
                      uStack_12c = local_140;
                      uStack_128 = local_140;
                      uStack_124 = local_140;
                      local_120 = (local_678.context)->instPrimID[0];
                      uStack_11c = local_120;
                      uStack_118 = local_120;
                      uStack_114 = local_120;
                      uStack_110 = local_120;
                      uStack_10c = local_120;
                      uStack_108 = local_120;
                      uStack_104 = local_120;
                      local_640 = local_260;
                      local_678.valid = (int *)local_640;
                      local_678.geometryUserPtr = pGVar76->userPtr;
                      local_678.hit = (RTCHitN *)&local_220;
                      local_678.N = 8;
                      local_520 = auVar227._0_32_;
                      local_678.ray = (RTCRayN *)ray;
                      if (pGVar76->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar196 = ZEXT1664(local_200._0_16_);
                        auVar206 = ZEXT1664(auVar203);
                        auVar211 = ZEXT1664(auVar89);
                        (*pGVar76->intersectionFilterN)(&local_678);
                        auVar217 = ZEXT3264(local_5c0);
                        auVar227 = ZEXT3264(local_520);
                        auVar228 = ZEXT3264(local_600);
                        auVar231 = ZEXT3264(local_580);
                        auVar230 = ZEXT3264(local_560);
                        auVar82 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar229 = ZEXT1664(auVar82);
                        pGVar76 = local_5a0;
                      }
                      if (local_640 == (undefined1  [32])0x0) {
LAB_01ad65a2:
                        *(int *)(ray + k * 4 + 0x100) = auVar227._0_4_;
                      }
                      else {
                        p_Var11 = context->args->filter;
                        if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar76->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar196 = ZEXT1664(auVar196._0_16_);
                          auVar206 = ZEXT1664(auVar206._0_16_);
                          auVar211 = ZEXT1664(auVar211._0_16_);
                          (*p_Var11)(&local_678);
                          auVar217 = ZEXT3264(local_5c0);
                          auVar227 = ZEXT3264(local_520);
                          auVar228 = ZEXT3264(local_600);
                          auVar231 = ZEXT3264(local_580);
                          auVar230 = ZEXT3264(local_560);
                          auVar82 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                          auVar229 = ZEXT1664(auVar82);
                          pGVar76 = local_5a0;
                        }
                        if (local_640 == (undefined1  [32])0x0) goto LAB_01ad65a2;
                        uVar27 = vptestmd_avx512vl(local_640,local_640);
                        iVar1 = *(int *)(local_678.hit + 4);
                        iVar2 = *(int *)(local_678.hit + 8);
                        iVar56 = *(int *)(local_678.hit + 0xc);
                        iVar57 = *(int *)(local_678.hit + 0x10);
                        iVar58 = *(int *)(local_678.hit + 0x14);
                        iVar59 = *(int *)(local_678.hit + 0x18);
                        iVar60 = *(int *)(local_678.hit + 0x1c);
                        bVar78 = (byte)uVar27;
                        bVar12 = (bool)((byte)(uVar27 >> 1) & 1);
                        bVar13 = (bool)((byte)(uVar27 >> 2) & 1);
                        bVar14 = (bool)((byte)(uVar27 >> 3) & 1);
                        bVar15 = (bool)((byte)(uVar27 >> 4) & 1);
                        bVar16 = (bool)((byte)(uVar27 >> 5) & 1);
                        bVar17 = (bool)((byte)(uVar27 >> 6) & 1);
                        bVar18 = SUB81(uVar27 >> 7,0);
                        *(uint *)(local_678.ray + 0x180) =
                             (uint)(bVar78 & 1) * *(int *)local_678.hit |
                             (uint)!(bool)(bVar78 & 1) * *(int *)(local_678.ray + 0x180);
                        *(uint *)(local_678.ray + 0x184) =
                             (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_678.ray + 0x184);
                        *(uint *)(local_678.ray + 0x188) =
                             (uint)bVar13 * iVar2 | (uint)!bVar13 * *(int *)(local_678.ray + 0x188);
                        *(uint *)(local_678.ray + 0x18c) =
                             (uint)bVar14 * iVar56 | (uint)!bVar14 * *(int *)(local_678.ray + 0x18c)
                        ;
                        *(uint *)(local_678.ray + 400) =
                             (uint)bVar15 * iVar57 | (uint)!bVar15 * *(int *)(local_678.ray + 400);
                        *(uint *)(local_678.ray + 0x194) =
                             (uint)bVar16 * iVar58 | (uint)!bVar16 * *(int *)(local_678.ray + 0x194)
                        ;
                        *(uint *)(local_678.ray + 0x198) =
                             (uint)bVar17 * iVar59 | (uint)!bVar17 * *(int *)(local_678.ray + 0x198)
                        ;
                        *(uint *)(local_678.ray + 0x19c) =
                             (uint)bVar18 * iVar60 | (uint)!bVar18 * *(int *)(local_678.ray + 0x19c)
                        ;
                        iVar1 = *(int *)(local_678.hit + 0x24);
                        iVar2 = *(int *)(local_678.hit + 0x28);
                        iVar56 = *(int *)(local_678.hit + 0x2c);
                        iVar57 = *(int *)(local_678.hit + 0x30);
                        iVar58 = *(int *)(local_678.hit + 0x34);
                        iVar59 = *(int *)(local_678.hit + 0x38);
                        iVar60 = *(int *)(local_678.hit + 0x3c);
                        bVar12 = (bool)((byte)(uVar27 >> 1) & 1);
                        bVar13 = (bool)((byte)(uVar27 >> 2) & 1);
                        bVar14 = (bool)((byte)(uVar27 >> 3) & 1);
                        bVar15 = (bool)((byte)(uVar27 >> 4) & 1);
                        bVar16 = (bool)((byte)(uVar27 >> 5) & 1);
                        bVar17 = (bool)((byte)(uVar27 >> 6) & 1);
                        bVar18 = SUB81(uVar27 >> 7,0);
                        *(uint *)(local_678.ray + 0x1a0) =
                             (uint)(bVar78 & 1) * *(int *)(local_678.hit + 0x20) |
                             (uint)!(bool)(bVar78 & 1) * *(int *)(local_678.ray + 0x1a0);
                        *(uint *)(local_678.ray + 0x1a4) =
                             (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_678.ray + 0x1a4);
                        *(uint *)(local_678.ray + 0x1a8) =
                             (uint)bVar13 * iVar2 | (uint)!bVar13 * *(int *)(local_678.ray + 0x1a8);
                        *(uint *)(local_678.ray + 0x1ac) =
                             (uint)bVar14 * iVar56 | (uint)!bVar14 * *(int *)(local_678.ray + 0x1ac)
                        ;
                        *(uint *)(local_678.ray + 0x1b0) =
                             (uint)bVar15 * iVar57 | (uint)!bVar15 * *(int *)(local_678.ray + 0x1b0)
                        ;
                        *(uint *)(local_678.ray + 0x1b4) =
                             (uint)bVar16 * iVar58 | (uint)!bVar16 * *(int *)(local_678.ray + 0x1b4)
                        ;
                        *(uint *)(local_678.ray + 0x1b8) =
                             (uint)bVar17 * iVar59 | (uint)!bVar17 * *(int *)(local_678.ray + 0x1b8)
                        ;
                        *(uint *)(local_678.ray + 0x1bc) =
                             (uint)bVar18 * iVar60 | (uint)!bVar18 * *(int *)(local_678.ray + 0x1bc)
                        ;
                        iVar1 = *(int *)(local_678.hit + 0x44);
                        iVar2 = *(int *)(local_678.hit + 0x48);
                        iVar56 = *(int *)(local_678.hit + 0x4c);
                        iVar57 = *(int *)(local_678.hit + 0x50);
                        iVar58 = *(int *)(local_678.hit + 0x54);
                        iVar59 = *(int *)(local_678.hit + 0x58);
                        iVar60 = *(int *)(local_678.hit + 0x5c);
                        bVar12 = (bool)((byte)(uVar27 >> 1) & 1);
                        bVar13 = (bool)((byte)(uVar27 >> 2) & 1);
                        bVar14 = (bool)((byte)(uVar27 >> 3) & 1);
                        bVar15 = (bool)((byte)(uVar27 >> 4) & 1);
                        bVar16 = (bool)((byte)(uVar27 >> 5) & 1);
                        bVar17 = (bool)((byte)(uVar27 >> 6) & 1);
                        bVar18 = SUB81(uVar27 >> 7,0);
                        *(uint *)(local_678.ray + 0x1c0) =
                             (uint)(bVar78 & 1) * *(int *)(local_678.hit + 0x40) |
                             (uint)!(bool)(bVar78 & 1) * *(int *)(local_678.ray + 0x1c0);
                        *(uint *)(local_678.ray + 0x1c4) =
                             (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_678.ray + 0x1c4);
                        *(uint *)(local_678.ray + 0x1c8) =
                             (uint)bVar13 * iVar2 | (uint)!bVar13 * *(int *)(local_678.ray + 0x1c8);
                        *(uint *)(local_678.ray + 0x1cc) =
                             (uint)bVar14 * iVar56 | (uint)!bVar14 * *(int *)(local_678.ray + 0x1cc)
                        ;
                        *(uint *)(local_678.ray + 0x1d0) =
                             (uint)bVar15 * iVar57 | (uint)!bVar15 * *(int *)(local_678.ray + 0x1d0)
                        ;
                        *(uint *)(local_678.ray + 0x1d4) =
                             (uint)bVar16 * iVar58 | (uint)!bVar16 * *(int *)(local_678.ray + 0x1d4)
                        ;
                        *(uint *)(local_678.ray + 0x1d8) =
                             (uint)bVar17 * iVar59 | (uint)!bVar17 * *(int *)(local_678.ray + 0x1d8)
                        ;
                        *(uint *)(local_678.ray + 0x1dc) =
                             (uint)bVar18 * iVar60 | (uint)!bVar18 * *(int *)(local_678.ray + 0x1dc)
                        ;
                        iVar1 = *(int *)(local_678.hit + 100);
                        iVar2 = *(int *)(local_678.hit + 0x68);
                        iVar56 = *(int *)(local_678.hit + 0x6c);
                        iVar57 = *(int *)(local_678.hit + 0x70);
                        iVar58 = *(int *)(local_678.hit + 0x74);
                        iVar59 = *(int *)(local_678.hit + 0x78);
                        iVar60 = *(int *)(local_678.hit + 0x7c);
                        bVar12 = (bool)((byte)(uVar27 >> 1) & 1);
                        bVar13 = (bool)((byte)(uVar27 >> 2) & 1);
                        bVar14 = (bool)((byte)(uVar27 >> 3) & 1);
                        bVar15 = (bool)((byte)(uVar27 >> 4) & 1);
                        bVar16 = (bool)((byte)(uVar27 >> 5) & 1);
                        bVar17 = (bool)((byte)(uVar27 >> 6) & 1);
                        bVar18 = SUB81(uVar27 >> 7,0);
                        *(uint *)(local_678.ray + 0x1e0) =
                             (uint)(bVar78 & 1) * *(int *)(local_678.hit + 0x60) |
                             (uint)!(bool)(bVar78 & 1) * *(int *)(local_678.ray + 0x1e0);
                        *(uint *)(local_678.ray + 0x1e4) =
                             (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_678.ray + 0x1e4);
                        *(uint *)(local_678.ray + 0x1e8) =
                             (uint)bVar13 * iVar2 | (uint)!bVar13 * *(int *)(local_678.ray + 0x1e8);
                        *(uint *)(local_678.ray + 0x1ec) =
                             (uint)bVar14 * iVar56 | (uint)!bVar14 * *(int *)(local_678.ray + 0x1ec)
                        ;
                        *(uint *)(local_678.ray + 0x1f0) =
                             (uint)bVar15 * iVar57 | (uint)!bVar15 * *(int *)(local_678.ray + 0x1f0)
                        ;
                        *(uint *)(local_678.ray + 500) =
                             (uint)bVar16 * iVar58 | (uint)!bVar16 * *(int *)(local_678.ray + 500);
                        *(uint *)(local_678.ray + 0x1f8) =
                             (uint)bVar17 * iVar59 | (uint)!bVar17 * *(int *)(local_678.ray + 0x1f8)
                        ;
                        *(uint *)(local_678.ray + 0x1fc) =
                             (uint)bVar18 * iVar60 | (uint)!bVar18 * *(int *)(local_678.ray + 0x1fc)
                        ;
                        iVar1 = *(int *)(local_678.hit + 0x84);
                        iVar2 = *(int *)(local_678.hit + 0x88);
                        iVar56 = *(int *)(local_678.hit + 0x8c);
                        iVar57 = *(int *)(local_678.hit + 0x90);
                        iVar58 = *(int *)(local_678.hit + 0x94);
                        iVar59 = *(int *)(local_678.hit + 0x98);
                        iVar60 = *(int *)(local_678.hit + 0x9c);
                        bVar12 = (bool)((byte)(uVar27 >> 1) & 1);
                        bVar13 = (bool)((byte)(uVar27 >> 2) & 1);
                        bVar14 = (bool)((byte)(uVar27 >> 3) & 1);
                        bVar15 = (bool)((byte)(uVar27 >> 4) & 1);
                        bVar16 = (bool)((byte)(uVar27 >> 5) & 1);
                        bVar17 = (bool)((byte)(uVar27 >> 6) & 1);
                        bVar18 = SUB81(uVar27 >> 7,0);
                        *(uint *)(local_678.ray + 0x200) =
                             (uint)(bVar78 & 1) * *(int *)(local_678.hit + 0x80) |
                             (uint)!(bool)(bVar78 & 1) * *(int *)(local_678.ray + 0x200);
                        *(uint *)(local_678.ray + 0x204) =
                             (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_678.ray + 0x204);
                        *(uint *)(local_678.ray + 0x208) =
                             (uint)bVar13 * iVar2 | (uint)!bVar13 * *(int *)(local_678.ray + 0x208);
                        *(uint *)(local_678.ray + 0x20c) =
                             (uint)bVar14 * iVar56 | (uint)!bVar14 * *(int *)(local_678.ray + 0x20c)
                        ;
                        *(uint *)(local_678.ray + 0x210) =
                             (uint)bVar15 * iVar57 | (uint)!bVar15 * *(int *)(local_678.ray + 0x210)
                        ;
                        *(uint *)(local_678.ray + 0x214) =
                             (uint)bVar16 * iVar58 | (uint)!bVar16 * *(int *)(local_678.ray + 0x214)
                        ;
                        *(uint *)(local_678.ray + 0x218) =
                             (uint)bVar17 * iVar59 | (uint)!bVar17 * *(int *)(local_678.ray + 0x218)
                        ;
                        *(uint *)(local_678.ray + 0x21c) =
                             (uint)bVar18 * iVar60 | (uint)!bVar18 * *(int *)(local_678.ray + 0x21c)
                        ;
                        auVar107 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_678.hit + 0xa0));
                        *(undefined1 (*) [32])(local_678.ray + 0x220) = auVar107;
                        auVar107 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_678.hit + 0xc0));
                        *(undefined1 (*) [32])(local_678.ray + 0x240) = auVar107;
                        auVar107 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_678.hit + 0xe0));
                        *(undefined1 (*) [32])(local_678.ray + 0x260) = auVar107;
                        auVar107 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_678.hit + 0x100))
                        ;
                        *(undefined1 (*) [32])(local_678.ray + 0x280) = auVar107;
                        auVar227 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
                      }
                      auVar98 = auVar228._0_32_;
                      bVar78 = ~(byte)(1 << ((uint)uVar69 & 0x1f)) & (byte)uVar73;
                      uVar143 = auVar227._0_4_;
                      auVar155._4_4_ = uVar143;
                      auVar155._0_4_ = uVar143;
                      auVar155._8_4_ = uVar143;
                      auVar155._12_4_ = uVar143;
                      auVar155._16_4_ = uVar143;
                      auVar155._20_4_ = uVar143;
                      auVar155._24_4_ = uVar143;
                      auVar155._28_4_ = uVar143;
                      uVar25 = vcmpps_avx512vl(auVar217._0_32_,auVar155,2);
                      if ((bVar78 & (byte)uVar25) == 0) goto LAB_01ad53c7;
                      bVar78 = bVar78 & (byte)uVar25;
                      uVar73 = (ulong)bVar78;
                      auVar156._8_4_ = 0x7f800000;
                      auVar156._0_8_ = 0x7f8000007f800000;
                      auVar156._12_4_ = 0x7f800000;
                      auVar156._16_4_ = 0x7f800000;
                      auVar156._20_4_ = 0x7f800000;
                      auVar156._24_4_ = 0x7f800000;
                      auVar156._28_4_ = 0x7f800000;
                      auVar107 = vblendmps_avx512vl(auVar156,auVar217._0_32_);
                      auVar133._0_4_ =
                           (uint)(bVar78 & 1) * auVar107._0_4_ |
                           (uint)!(bool)(bVar78 & 1) * 0x7f800000;
                      bVar12 = (bool)(bVar78 >> 1 & 1);
                      auVar133._4_4_ = (uint)bVar12 * auVar107._4_4_ | (uint)!bVar12 * 0x7f800000;
                      bVar12 = (bool)(bVar78 >> 2 & 1);
                      auVar133._8_4_ = (uint)bVar12 * auVar107._8_4_ | (uint)!bVar12 * 0x7f800000;
                      bVar12 = (bool)(bVar78 >> 3 & 1);
                      auVar133._12_4_ = (uint)bVar12 * auVar107._12_4_ | (uint)!bVar12 * 0x7f800000;
                      bVar12 = (bool)(bVar78 >> 4 & 1);
                      auVar133._16_4_ = (uint)bVar12 * auVar107._16_4_ | (uint)!bVar12 * 0x7f800000;
                      bVar12 = (bool)(bVar78 >> 5 & 1);
                      auVar133._20_4_ = (uint)bVar12 * auVar107._20_4_ | (uint)!bVar12 * 0x7f800000;
                      bVar12 = (bool)(bVar78 >> 6 & 1);
                      auVar133._24_4_ = (uint)bVar12 * auVar107._24_4_ | (uint)!bVar12 * 0x7f800000;
                      auVar133._28_4_ =
                           (uint)(bVar78 >> 7) * auVar107._28_4_ |
                           (uint)!(bool)(bVar78 >> 7) * 0x7f800000;
                      auVar107 = vshufps_avx(auVar133,auVar133,0xb1);
                      auVar107 = vminps_avx(auVar133,auVar107);
                      auVar108 = vshufpd_avx(auVar107,auVar107,5);
                      auVar107 = vminps_avx(auVar107,auVar108);
                      auVar108 = vpermpd_avx2(auVar107,0x4e);
                      auVar107 = vminps_avx(auVar107,auVar108);
                      uVar25 = vcmpps_avx512vl(auVar133,auVar107,0);
                      bVar68 = (byte)uVar25 & bVar78;
                      if (bVar68 != 0) {
                        bVar78 = bVar68;
                      }
                      uVar70 = 0;
                      for (uVar71 = (uint)bVar78; (uVar71 & 1) == 0;
                          uVar71 = uVar71 >> 1 | 0x80000000) {
                        uVar70 = uVar70 + 1;
                      }
                      uVar69 = (ulong)uVar70;
                    } while( true );
                  }
                  fVar165 = local_2e0[uVar69];
                  uVar143 = *(undefined4 *)(local_2c0 + uVar69 * 4);
                  fVar157 = 1.0 - fVar165;
                  auVar19 = vfnmadd231ss_fma(ZEXT416((uint)(fVar165 * (fVar157 + fVar157))),
                                             ZEXT416((uint)fVar157),ZEXT416((uint)fVar157));
                  auVar146 = ZEXT416((uint)fVar165);
                  auVar82 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar146,
                                            ZEXT416(0xc0a00000));
                  auVar89 = vfmadd231ss_fma(ZEXT416((uint)(fVar165 * fVar165 * 3.0)),
                                            ZEXT416((uint)(fVar165 + fVar165)),auVar82);
                  auVar211 = ZEXT1664(auVar89);
                  auVar82 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar146,
                                            ZEXT416(0x40000000));
                  auVar82 = vfmadd231ss_fma(ZEXT416((uint)(fVar157 * fVar157 * -3.0)),
                                            ZEXT416((uint)(fVar157 + fVar157)),auVar82);
                  auVar146 = vfmadd231ss_fma(ZEXT416((uint)(fVar165 * fVar165)),auVar146,
                                             ZEXT416((uint)(fVar157 * -2.0)));
                  fVar157 = auVar19._0_4_ * 0.5;
                  fVar158 = auVar89._0_4_ * 0.5;
                  auVar196 = ZEXT464((uint)fVar158);
                  fVar159 = auVar82._0_4_ * 0.5;
                  fVar172 = auVar146._0_4_ * 0.5;
                  auVar177._0_4_ = fVar172 * local_6c0;
                  auVar177._4_4_ = fVar172 * fStack_6bc;
                  auVar177._8_4_ = fVar172 * fStack_6b8;
                  auVar177._12_4_ = fVar172 * fStack_6b4;
                  auVar198._4_4_ = fVar159;
                  auVar198._0_4_ = fVar159;
                  auVar198._8_4_ = fVar159;
                  auVar198._12_4_ = fVar159;
                  auVar82 = vfmadd132ps_fma(auVar198,auVar177,*pauVar4);
                  auVar206 = ZEXT1664(auVar82);
                  auVar178._4_4_ = fVar158;
                  auVar178._0_4_ = fVar158;
                  auVar178._8_4_ = fVar158;
                  auVar178._12_4_ = fVar158;
                  auVar82 = vfmadd132ps_fma(auVar178,auVar82,*pauVar3);
                  auVar168._4_4_ = fVar157;
                  auVar168._0_4_ = fVar157;
                  auVar168._8_4_ = fVar157;
                  auVar168._12_4_ = fVar157;
                  auVar82 = vfmadd213ps_fma(auVar168,auVar81,auVar82);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2a0 + uVar69 * 4);
                  *(int *)(ray + k * 4 + 0x180) = auVar82._0_4_;
                  uVar10 = vextractps_avx(auVar82,1);
                  *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar10;
                  uVar10 = vextractps_avx(auVar82,2);
                  *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar10;
                  *(float *)(ray + k * 4 + 0x1e0) = fVar165;
                  *(undefined4 *)(ray + k * 4 + 0x200) = uVar143;
                  *(uint *)(ray + k * 4 + 0x220) = uVar9;
                  *(uint *)(ray + k * 4 + 0x240) = uVar74;
                  *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                }
              }
            }
          }
        }
      }
LAB_01ad53c7:
      if (8 < iVar72) {
        auVar107 = vpbroadcastd_avx512vl();
        auVar228 = ZEXT3264(auVar107);
        local_520._4_4_ = local_5e0._0_4_;
        local_520._0_4_ = local_5e0._0_4_;
        local_520._8_4_ = local_5e0._0_4_;
        local_520._12_4_ = local_5e0._0_4_;
        local_520._16_4_ = local_5e0._0_4_;
        local_520._20_4_ = local_5e0._0_4_;
        local_520._24_4_ = local_5e0._0_4_;
        local_520._28_4_ = local_5e0._0_4_;
        uStack_4dc = local_4e0;
        uStack_4d8 = local_4e0;
        uStack_4d4 = local_4e0;
        uStack_4d0 = local_4e0;
        uStack_4cc = local_4e0;
        uStack_4c8 = local_4e0;
        uStack_4c4 = local_4e0;
        fStack_598 = 1.0 / (float)local_500._0_4_;
        local_500 = vpbroadcastd_avx512vl();
        local_4c0 = vpbroadcastd_avx512vl();
        lVar75 = 8;
        local_600 = auVar98;
        fStack_594 = fStack_598;
        fStack_590 = fStack_598;
        fStack_58c = fStack_598;
        fStack_588 = fStack_598;
        fStack_584 = fStack_598;
        local_5a0._0_4_ = fStack_598;
        local_5a0._4_4_ = fStack_598;
LAB_01ad5471:
        auVar107 = vpbroadcastd_avx512vl();
        auVar107 = vpor_avx2(auVar107,_DAT_01fe9900);
        uVar26 = vpcmpgtd_avx512vl(auVar228._0_32_,auVar107);
        auVar107 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar75 * 4 + lVar28);
        auVar108 = *(undefined1 (*) [32])(lVar28 + 0x21b37f0 + lVar75 * 4);
        auVar105 = *(undefined1 (*) [32])(lVar28 + 0x21b3c74 + lVar75 * 4);
        auVar104 = *(undefined1 (*) [32])(lVar28 + 0x21b40f8 + lVar75 * 4);
        auVar217._0_4_ = auVar104._0_4_ * (float)local_480._0_4_;
        auVar217._4_4_ = auVar104._4_4_ * (float)local_480._4_4_;
        auVar217._8_4_ = auVar104._8_4_ * fStack_478;
        auVar217._12_4_ = auVar104._12_4_ * fStack_474;
        auVar217._16_4_ = auVar104._16_4_ * fStack_470;
        auVar217._20_4_ = auVar104._20_4_ * fStack_46c;
        auVar217._28_36_ = auVar206._28_36_;
        auVar217._24_4_ = auVar104._24_4_ * fStack_468;
        auVar206._0_4_ = auVar104._0_4_ * (float)local_4a0._0_4_;
        auVar206._4_4_ = auVar104._4_4_ * (float)local_4a0._4_4_;
        auVar206._8_4_ = auVar104._8_4_ * fStack_498;
        auVar206._12_4_ = auVar104._12_4_ * fStack_494;
        auVar206._16_4_ = auVar104._16_4_ * fStack_490;
        auVar206._20_4_ = auVar104._20_4_ * fStack_48c;
        auVar206._28_36_ = auVar196._28_36_;
        auVar206._24_4_ = auVar104._24_4_ * fStack_488;
        auVar91 = vmulps_avx512vl(local_e0,auVar104);
        auVar92 = vfmadd231ps_avx512vl(auVar217._0_32_,auVar105,local_440);
        auVar93 = vfmadd231ps_avx512vl(auVar206._0_32_,auVar105,local_460);
        auVar91 = vfmadd231ps_avx512vl(auVar91,auVar105,local_c0);
        auVar92 = vfmadd231ps_avx512vl(auVar92,auVar108,local_400);
        auVar93 = vfmadd231ps_avx512vl(auVar93,auVar108,local_420);
        auVar103 = vfmadd231ps_avx512vl(auVar91,auVar108,local_a0);
        auVar82 = vfmadd231ps_fma(auVar92,auVar107,local_3c0);
        auVar206 = ZEXT1664(auVar82);
        auVar89 = vfmadd231ps_fma(auVar93,auVar107,local_3e0);
        auVar196 = ZEXT1664(auVar89);
        auVar91 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar75 * 4 + lVar28);
        auVar92 = *(undefined1 (*) [32])(lVar28 + 0x21b5c10 + lVar75 * 4);
        auVar96 = vfmadd231ps_avx512vl(auVar103,auVar107,local_80);
        auVar93 = *(undefined1 (*) [32])(lVar28 + 0x21b6094 + lVar75 * 4);
        auVar103 = *(undefined1 (*) [32])(lVar28 + 0x21b6518 + lVar75 * 4);
        auVar227._0_4_ = auVar103._0_4_ * (float)local_480._0_4_;
        auVar227._4_4_ = auVar103._4_4_ * (float)local_480._4_4_;
        auVar227._8_4_ = auVar103._8_4_ * fStack_478;
        auVar227._12_4_ = auVar103._12_4_ * fStack_474;
        auVar227._16_4_ = auVar103._16_4_ * fStack_470;
        auVar227._20_4_ = auVar103._20_4_ * fStack_46c;
        auVar227._28_36_ = auVar211._28_36_;
        auVar227._24_4_ = auVar103._24_4_ * fStack_468;
        auVar39._4_4_ = auVar103._4_4_ * (float)local_4a0._4_4_;
        auVar39._0_4_ = auVar103._0_4_ * (float)local_4a0._0_4_;
        auVar39._8_4_ = auVar103._8_4_ * fStack_498;
        auVar39._12_4_ = auVar103._12_4_ * fStack_494;
        auVar39._16_4_ = auVar103._16_4_ * fStack_490;
        auVar39._20_4_ = auVar103._20_4_ * fStack_48c;
        auVar39._24_4_ = auVar103._24_4_ * fStack_488;
        auVar39._28_4_ = uStack_484;
        auVar94 = vmulps_avx512vl(local_e0,auVar103);
        auVar95 = vfmadd231ps_avx512vl(auVar227._0_32_,auVar93,local_440);
        auVar97 = vfmadd231ps_avx512vl(auVar39,auVar93,local_460);
        auVar94 = vfmadd231ps_avx512vl(auVar94,auVar93,local_c0);
        auVar95 = vfmadd231ps_avx512vl(auVar95,auVar92,local_400);
        auVar97 = vfmadd231ps_avx512vl(auVar97,auVar92,local_420);
        auVar94 = vfmadd231ps_avx512vl(auVar94,auVar92,local_a0);
        auVar146 = vfmadd231ps_fma(auVar95,auVar91,local_3c0);
        auVar211 = ZEXT1664(auVar146);
        auVar19 = vfmadd231ps_fma(auVar97,auVar91,local_3e0);
        auVar97 = vfmadd231ps_avx512vl(auVar94,auVar91,local_80);
        auVar98 = vmaxps_avx512vl(auVar96,auVar97);
        auVar94 = vsubps_avx(ZEXT1632(auVar146),ZEXT1632(auVar82));
        auVar95 = vsubps_avx(ZEXT1632(auVar19),ZEXT1632(auVar89));
        auVar99 = vmulps_avx512vl(ZEXT1632(auVar89),auVar94);
        auVar100 = vmulps_avx512vl(ZEXT1632(auVar82),auVar95);
        auVar99 = vsubps_avx512vl(auVar99,auVar100);
        auVar100 = vmulps_avx512vl(auVar95,auVar95);
        auVar100 = vfmadd231ps_avx512vl(auVar100,auVar94,auVar94);
        auVar98 = vmulps_avx512vl(auVar98,auVar98);
        auVar98 = vmulps_avx512vl(auVar98,auVar100);
        auVar99 = vmulps_avx512vl(auVar99,auVar99);
        uVar25 = vcmpps_avx512vl(auVar99,auVar98,2);
        bVar78 = (byte)uVar26 & (byte)uVar25;
        if (bVar78 != 0) {
          auVar103 = vmulps_avx512vl(local_240,auVar103);
          auVar93 = vfmadd213ps_avx512vl(auVar93,local_600,auVar103);
          local_580 = auVar231._0_32_;
          auVar92 = vfmadd213ps_avx512vl(auVar92,local_580,auVar93);
          local_560 = auVar230._0_32_;
          auVar91 = vfmadd213ps_avx512vl(auVar91,local_560,auVar92);
          auVar104 = vmulps_avx512vl(local_240,auVar104);
          auVar105 = vfmadd213ps_avx512vl(auVar105,local_600,auVar104);
          auVar108 = vfmadd213ps_avx512vl(auVar108,local_580,auVar105);
          auVar92 = vfmadd213ps_avx512vl(auVar107,local_560,auVar108);
          auVar107 = *(undefined1 (*) [32])(lVar28 + 0x21b457c + lVar75 * 4);
          auVar108 = *(undefined1 (*) [32])(lVar28 + 0x21b4a00 + lVar75 * 4);
          auVar105 = *(undefined1 (*) [32])(lVar28 + 0x21b4e84 + lVar75 * 4);
          auVar104 = *(undefined1 (*) [32])(lVar28 + 0x21b5308 + lVar75 * 4);
          auVar93 = vmulps_avx512vl(_local_480,auVar104);
          auVar103 = vmulps_avx512vl(_local_4a0,auVar104);
          auVar104 = vmulps_avx512vl(local_240,auVar104);
          auVar93 = vfmadd231ps_avx512vl(auVar93,auVar105,local_440);
          auVar103 = vfmadd231ps_avx512vl(auVar103,auVar105,local_460);
          auVar88 = vfmadd231ps_fma(auVar104,auVar105,local_600);
          auVar105 = vfmadd231ps_avx512vl(auVar93,auVar108,local_400);
          auVar104 = vfmadd231ps_avx512vl(auVar103,auVar108,local_420);
          auVar108 = vfmadd231ps_avx512vl(ZEXT1632(auVar88),local_580,auVar108);
          auVar93 = vfmadd231ps_avx512vl(auVar105,auVar107,local_3c0);
          auVar104 = vfmadd231ps_avx512vl(auVar104,auVar107,local_3e0);
          auVar103 = vfmadd231ps_avx512vl(auVar108,local_560,auVar107);
          auVar107 = *(undefined1 (*) [32])(lVar28 + 0x21b699c + lVar75 * 4);
          auVar108 = *(undefined1 (*) [32])(lVar28 + 0x21b72a4 + lVar75 * 4);
          auVar105 = *(undefined1 (*) [32])(lVar28 + 0x21b7728 + lVar75 * 4);
          auVar98 = vmulps_avx512vl(_local_480,auVar105);
          auVar99 = vmulps_avx512vl(_local_4a0,auVar105);
          auVar105 = vmulps_avx512vl(local_240,auVar105);
          auVar98 = vfmadd231ps_avx512vl(auVar98,auVar108,local_440);
          auVar99 = vfmadd231ps_avx512vl(auVar99,auVar108,local_460);
          auVar105 = vfmadd231ps_avx512vl(auVar105,local_600,auVar108);
          auVar108 = *(undefined1 (*) [32])(lVar28 + 0x21b6e20 + lVar75 * 4);
          auVar98 = vfmadd231ps_avx512vl(auVar98,auVar108,local_400);
          auVar99 = vfmadd231ps_avx512vl(auVar99,auVar108,local_420);
          auVar108 = vfmadd231ps_avx512vl(auVar105,local_580,auVar108);
          auVar105 = vfmadd231ps_avx512vl(auVar98,auVar107,local_3c0);
          auVar98 = vfmadd231ps_avx512vl(auVar99,auVar107,local_3e0);
          auVar108 = vfmadd231ps_avx512vl(auVar108,local_560,auVar107);
          auVar99 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar93,auVar99);
          vandps_avx512vl(auVar104,auVar99);
          auVar107 = vmaxps_avx(auVar99,auVar99);
          vandps_avx512vl(auVar103,auVar99);
          auVar107 = vmaxps_avx(auVar107,auVar99);
          uVar69 = vcmpps_avx512vl(auVar107,local_520,1);
          bVar12 = (bool)((byte)uVar69 & 1);
          auVar121._0_4_ = (float)((uint)bVar12 * auVar94._0_4_ | (uint)!bVar12 * auVar93._0_4_);
          bVar12 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar121._4_4_ = (float)((uint)bVar12 * auVar94._4_4_ | (uint)!bVar12 * auVar93._4_4_);
          bVar12 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar121._8_4_ = (float)((uint)bVar12 * auVar94._8_4_ | (uint)!bVar12 * auVar93._8_4_);
          bVar12 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar121._12_4_ = (float)((uint)bVar12 * auVar94._12_4_ | (uint)!bVar12 * auVar93._12_4_);
          bVar12 = (bool)((byte)(uVar69 >> 4) & 1);
          auVar121._16_4_ = (float)((uint)bVar12 * auVar94._16_4_ | (uint)!bVar12 * auVar93._16_4_);
          bVar12 = (bool)((byte)(uVar69 >> 5) & 1);
          auVar121._20_4_ = (float)((uint)bVar12 * auVar94._20_4_ | (uint)!bVar12 * auVar93._20_4_);
          bVar12 = (bool)((byte)(uVar69 >> 6) & 1);
          auVar121._24_4_ = (float)((uint)bVar12 * auVar94._24_4_ | (uint)!bVar12 * auVar93._24_4_);
          bVar12 = SUB81(uVar69 >> 7,0);
          auVar121._28_4_ = (uint)bVar12 * auVar94._28_4_ | (uint)!bVar12 * auVar93._28_4_;
          bVar12 = (bool)((byte)uVar69 & 1);
          auVar122._0_4_ = (float)((uint)bVar12 * auVar95._0_4_ | (uint)!bVar12 * auVar104._0_4_);
          bVar12 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar122._4_4_ = (float)((uint)bVar12 * auVar95._4_4_ | (uint)!bVar12 * auVar104._4_4_);
          bVar12 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar122._8_4_ = (float)((uint)bVar12 * auVar95._8_4_ | (uint)!bVar12 * auVar104._8_4_);
          bVar12 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar122._12_4_ = (float)((uint)bVar12 * auVar95._12_4_ | (uint)!bVar12 * auVar104._12_4_)
          ;
          bVar12 = (bool)((byte)(uVar69 >> 4) & 1);
          auVar122._16_4_ = (float)((uint)bVar12 * auVar95._16_4_ | (uint)!bVar12 * auVar104._16_4_)
          ;
          bVar12 = (bool)((byte)(uVar69 >> 5) & 1);
          auVar122._20_4_ = (float)((uint)bVar12 * auVar95._20_4_ | (uint)!bVar12 * auVar104._20_4_)
          ;
          bVar12 = (bool)((byte)(uVar69 >> 6) & 1);
          auVar122._24_4_ = (float)((uint)bVar12 * auVar95._24_4_ | (uint)!bVar12 * auVar104._24_4_)
          ;
          bVar12 = SUB81(uVar69 >> 7,0);
          auVar122._28_4_ = (uint)bVar12 * auVar95._28_4_ | (uint)!bVar12 * auVar104._28_4_;
          vandps_avx512vl(auVar105,auVar99);
          vandps_avx512vl(auVar98,auVar99);
          auVar107 = vmaxps_avx(auVar122,auVar122);
          vandps_avx512vl(auVar108,auVar99);
          auVar107 = vmaxps_avx(auVar107,auVar122);
          uVar69 = vcmpps_avx512vl(auVar107,local_520,1);
          bVar12 = (bool)((byte)uVar69 & 1);
          auVar123._0_4_ = (uint)bVar12 * auVar94._0_4_ | (uint)!bVar12 * auVar105._0_4_;
          bVar12 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar123._4_4_ = (uint)bVar12 * auVar94._4_4_ | (uint)!bVar12 * auVar105._4_4_;
          bVar12 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar123._8_4_ = (uint)bVar12 * auVar94._8_4_ | (uint)!bVar12 * auVar105._8_4_;
          bVar12 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar123._12_4_ = (uint)bVar12 * auVar94._12_4_ | (uint)!bVar12 * auVar105._12_4_;
          bVar12 = (bool)((byte)(uVar69 >> 4) & 1);
          auVar123._16_4_ = (uint)bVar12 * auVar94._16_4_ | (uint)!bVar12 * auVar105._16_4_;
          bVar12 = (bool)((byte)(uVar69 >> 5) & 1);
          auVar123._20_4_ = (uint)bVar12 * auVar94._20_4_ | (uint)!bVar12 * auVar105._20_4_;
          bVar12 = (bool)((byte)(uVar69 >> 6) & 1);
          auVar123._24_4_ = (uint)bVar12 * auVar94._24_4_ | (uint)!bVar12 * auVar105._24_4_;
          bVar12 = SUB81(uVar69 >> 7,0);
          auVar123._28_4_ = (uint)bVar12 * auVar94._28_4_ | (uint)!bVar12 * auVar105._28_4_;
          bVar12 = (bool)((byte)uVar69 & 1);
          auVar124._0_4_ = (float)((uint)bVar12 * auVar95._0_4_ | (uint)!bVar12 * auVar98._0_4_);
          bVar12 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar124._4_4_ = (float)((uint)bVar12 * auVar95._4_4_ | (uint)!bVar12 * auVar98._4_4_);
          bVar12 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar124._8_4_ = (float)((uint)bVar12 * auVar95._8_4_ | (uint)!bVar12 * auVar98._8_4_);
          bVar12 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar124._12_4_ = (float)((uint)bVar12 * auVar95._12_4_ | (uint)!bVar12 * auVar98._12_4_);
          bVar12 = (bool)((byte)(uVar69 >> 4) & 1);
          auVar124._16_4_ = (float)((uint)bVar12 * auVar95._16_4_ | (uint)!bVar12 * auVar98._16_4_);
          bVar12 = (bool)((byte)(uVar69 >> 5) & 1);
          auVar124._20_4_ = (float)((uint)bVar12 * auVar95._20_4_ | (uint)!bVar12 * auVar98._20_4_);
          bVar12 = (bool)((byte)(uVar69 >> 6) & 1);
          auVar124._24_4_ = (float)((uint)bVar12 * auVar95._24_4_ | (uint)!bVar12 * auVar98._24_4_);
          bVar12 = SUB81(uVar69 >> 7,0);
          auVar124._28_4_ = (uint)bVar12 * auVar95._28_4_ | (uint)!bVar12 * auVar98._28_4_;
          auVar215._8_4_ = 0x80000000;
          auVar215._0_8_ = 0x8000000080000000;
          auVar215._12_4_ = 0x80000000;
          auVar215._16_4_ = 0x80000000;
          auVar215._20_4_ = 0x80000000;
          auVar215._24_4_ = 0x80000000;
          auVar215._28_4_ = 0x80000000;
          auVar107 = vxorps_avx512vl(auVar123,auVar215);
          auVar90 = vxorps_avx512vl(auVar99._0_16_,auVar99._0_16_);
          auVar108 = vfmadd213ps_avx512vl(auVar121,auVar121,ZEXT1632(auVar90));
          auVar88 = vfmadd231ps_fma(auVar108,auVar122,auVar122);
          auVar108 = vrsqrt14ps_avx512vl(ZEXT1632(auVar88));
          auVar225._8_4_ = 0xbf000000;
          auVar225._0_8_ = 0xbf000000bf000000;
          auVar225._12_4_ = 0xbf000000;
          auVar225._16_4_ = 0xbf000000;
          auVar225._20_4_ = 0xbf000000;
          auVar225._24_4_ = 0xbf000000;
          auVar225._28_4_ = 0xbf000000;
          fVar165 = auVar108._0_4_;
          fVar157 = auVar108._4_4_;
          fVar158 = auVar108._8_4_;
          fVar159 = auVar108._12_4_;
          fVar172 = auVar108._16_4_;
          fVar188 = auVar108._20_4_;
          fVar79 = auVar108._24_4_;
          auVar40._4_4_ = fVar157 * fVar157 * fVar157 * auVar88._4_4_ * -0.5;
          auVar40._0_4_ = fVar165 * fVar165 * fVar165 * auVar88._0_4_ * -0.5;
          auVar40._8_4_ = fVar158 * fVar158 * fVar158 * auVar88._8_4_ * -0.5;
          auVar40._12_4_ = fVar159 * fVar159 * fVar159 * auVar88._12_4_ * -0.5;
          auVar40._16_4_ = fVar172 * fVar172 * fVar172 * -0.0;
          auVar40._20_4_ = fVar188 * fVar188 * fVar188 * -0.0;
          auVar40._24_4_ = fVar79 * fVar79 * fVar79 * -0.0;
          auVar40._28_4_ = auVar122._28_4_;
          auVar105 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar108 = vfmadd231ps_avx512vl(auVar40,auVar105,auVar108);
          auVar41._4_4_ = auVar122._4_4_ * auVar108._4_4_;
          auVar41._0_4_ = auVar122._0_4_ * auVar108._0_4_;
          auVar41._8_4_ = auVar122._8_4_ * auVar108._8_4_;
          auVar41._12_4_ = auVar122._12_4_ * auVar108._12_4_;
          auVar41._16_4_ = auVar122._16_4_ * auVar108._16_4_;
          auVar41._20_4_ = auVar122._20_4_ * auVar108._20_4_;
          auVar41._24_4_ = auVar122._24_4_ * auVar108._24_4_;
          auVar41._28_4_ = 0;
          auVar42._4_4_ = auVar108._4_4_ * -auVar121._4_4_;
          auVar42._0_4_ = auVar108._0_4_ * -auVar121._0_4_;
          auVar42._8_4_ = auVar108._8_4_ * -auVar121._8_4_;
          auVar42._12_4_ = auVar108._12_4_ * -auVar121._12_4_;
          auVar42._16_4_ = auVar108._16_4_ * -auVar121._16_4_;
          auVar42._20_4_ = auVar108._20_4_ * -auVar121._20_4_;
          auVar42._24_4_ = auVar108._24_4_ * -auVar121._24_4_;
          auVar42._28_4_ = auVar122._28_4_;
          auVar104 = vmulps_avx512vl(auVar108,ZEXT1632(auVar90));
          auVar103 = ZEXT1632(auVar90);
          auVar108 = vfmadd213ps_avx512vl(auVar123,auVar123,auVar103);
          auVar108 = vfmadd231ps_avx512vl(auVar108,auVar124,auVar124);
          auVar93 = vrsqrt14ps_avx512vl(auVar108);
          auVar108 = vmulps_avx512vl(auVar108,auVar225);
          fVar165 = auVar93._0_4_;
          fVar157 = auVar93._4_4_;
          fVar158 = auVar93._8_4_;
          fVar159 = auVar93._12_4_;
          fVar172 = auVar93._16_4_;
          fVar188 = auVar93._20_4_;
          fVar79 = auVar93._24_4_;
          auVar43._4_4_ = fVar157 * fVar157 * fVar157 * auVar108._4_4_;
          auVar43._0_4_ = fVar165 * fVar165 * fVar165 * auVar108._0_4_;
          auVar43._8_4_ = fVar158 * fVar158 * fVar158 * auVar108._8_4_;
          auVar43._12_4_ = fVar159 * fVar159 * fVar159 * auVar108._12_4_;
          auVar43._16_4_ = fVar172 * fVar172 * fVar172 * auVar108._16_4_;
          auVar43._20_4_ = fVar188 * fVar188 * fVar188 * auVar108._20_4_;
          auVar43._24_4_ = fVar79 * fVar79 * fVar79 * auVar108._24_4_;
          auVar43._28_4_ = auVar108._28_4_;
          auVar108 = vfmadd231ps_avx512vl(auVar43,auVar105,auVar93);
          auVar44._4_4_ = auVar124._4_4_ * auVar108._4_4_;
          auVar44._0_4_ = auVar124._0_4_ * auVar108._0_4_;
          auVar44._8_4_ = auVar124._8_4_ * auVar108._8_4_;
          auVar44._12_4_ = auVar124._12_4_ * auVar108._12_4_;
          auVar44._16_4_ = auVar124._16_4_ * auVar108._16_4_;
          auVar44._20_4_ = auVar124._20_4_ * auVar108._20_4_;
          auVar44._24_4_ = auVar124._24_4_ * auVar108._24_4_;
          auVar44._28_4_ = auVar93._28_4_;
          auVar45._4_4_ = auVar108._4_4_ * auVar107._4_4_;
          auVar45._0_4_ = auVar108._0_4_ * auVar107._0_4_;
          auVar45._8_4_ = auVar108._8_4_ * auVar107._8_4_;
          auVar45._12_4_ = auVar108._12_4_ * auVar107._12_4_;
          auVar45._16_4_ = auVar108._16_4_ * auVar107._16_4_;
          auVar45._20_4_ = auVar108._20_4_ * auVar107._20_4_;
          auVar45._24_4_ = auVar108._24_4_ * auVar107._24_4_;
          auVar45._28_4_ = auVar107._28_4_;
          auVar107 = vmulps_avx512vl(auVar108,auVar103);
          auVar88 = vfmadd213ps_fma(auVar41,auVar96,ZEXT1632(auVar82));
          auVar84 = vfmadd213ps_fma(auVar42,auVar96,ZEXT1632(auVar89));
          auVar105 = vfmadd213ps_avx512vl(auVar104,auVar96,auVar92);
          auVar93 = vfmadd213ps_avx512vl(auVar44,auVar97,ZEXT1632(auVar146));
          auVar87 = vfnmadd213ps_fma(auVar41,auVar96,ZEXT1632(auVar82));
          auVar82 = vfmadd213ps_fma(auVar45,auVar97,ZEXT1632(auVar19));
          auVar85 = vfnmadd213ps_fma(auVar42,auVar96,ZEXT1632(auVar89));
          auVar89 = vfmadd213ps_fma(auVar107,auVar97,auVar91);
          auVar86 = vfnmadd231ps_fma(auVar92,auVar96,auVar104);
          auVar144 = vfnmadd213ps_fma(auVar44,auVar97,ZEXT1632(auVar146));
          auVar145 = vfnmadd213ps_fma(auVar45,auVar97,ZEXT1632(auVar19));
          auVar160 = vfnmadd231ps_fma(auVar91,auVar97,auVar107);
          auVar91 = vsubps_avx512vl(auVar93,ZEXT1632(auVar87));
          auVar107 = vsubps_avx(ZEXT1632(auVar82),ZEXT1632(auVar85));
          auVar108 = vsubps_avx(ZEXT1632(auVar89),ZEXT1632(auVar86));
          auVar46._4_4_ = auVar107._4_4_ * auVar86._4_4_;
          auVar46._0_4_ = auVar107._0_4_ * auVar86._0_4_;
          auVar46._8_4_ = auVar107._8_4_ * auVar86._8_4_;
          auVar46._12_4_ = auVar107._12_4_ * auVar86._12_4_;
          auVar46._16_4_ = auVar107._16_4_ * 0.0;
          auVar46._20_4_ = auVar107._20_4_ * 0.0;
          auVar46._24_4_ = auVar107._24_4_ * 0.0;
          auVar46._28_4_ = auVar104._28_4_;
          auVar146 = vfmsub231ps_fma(auVar46,ZEXT1632(auVar85),auVar108);
          auVar47._4_4_ = auVar108._4_4_ * auVar87._4_4_;
          auVar47._0_4_ = auVar108._0_4_ * auVar87._0_4_;
          auVar47._8_4_ = auVar108._8_4_ * auVar87._8_4_;
          auVar47._12_4_ = auVar108._12_4_ * auVar87._12_4_;
          auVar47._16_4_ = auVar108._16_4_ * 0.0;
          auVar47._20_4_ = auVar108._20_4_ * 0.0;
          auVar47._24_4_ = auVar108._24_4_ * 0.0;
          auVar47._28_4_ = auVar108._28_4_;
          auVar19 = vfmsub231ps_fma(auVar47,ZEXT1632(auVar86),auVar91);
          auVar48._4_4_ = auVar85._4_4_ * auVar91._4_4_;
          auVar48._0_4_ = auVar85._0_4_ * auVar91._0_4_;
          auVar48._8_4_ = auVar85._8_4_ * auVar91._8_4_;
          auVar48._12_4_ = auVar85._12_4_ * auVar91._12_4_;
          auVar48._16_4_ = auVar91._16_4_ * 0.0;
          auVar48._20_4_ = auVar91._20_4_ * 0.0;
          auVar48._24_4_ = auVar91._24_4_ * 0.0;
          auVar48._28_4_ = auVar91._28_4_;
          auVar83 = vfmsub231ps_fma(auVar48,ZEXT1632(auVar87),auVar107);
          auVar107 = vfmadd231ps_avx512vl(ZEXT1632(auVar83),auVar103,ZEXT1632(auVar19));
          auVar107 = vfmadd231ps_avx512vl(auVar107,auVar103,ZEXT1632(auVar146));
          auVar99 = ZEXT1632(auVar90);
          uVar69 = vcmpps_avx512vl(auVar107,auVar99,2);
          bVar68 = (byte)uVar69;
          fVar135 = (float)((uint)(bVar68 & 1) * auVar88._0_4_ |
                           (uint)!(bool)(bVar68 & 1) * auVar144._0_4_);
          bVar12 = (bool)((byte)(uVar69 >> 1) & 1);
          fVar137 = (float)((uint)bVar12 * auVar88._4_4_ | (uint)!bVar12 * auVar144._4_4_);
          bVar12 = (bool)((byte)(uVar69 >> 2) & 1);
          fVar140 = (float)((uint)bVar12 * auVar88._8_4_ | (uint)!bVar12 * auVar144._8_4_);
          bVar12 = (bool)((byte)(uVar69 >> 3) & 1);
          fVar141 = (float)((uint)bVar12 * auVar88._12_4_ | (uint)!bVar12 * auVar144._12_4_);
          auVar103 = ZEXT1632(CONCAT412(fVar141,CONCAT48(fVar140,CONCAT44(fVar137,fVar135))));
          fVar136 = (float)((uint)(bVar68 & 1) * auVar84._0_4_ |
                           (uint)!(bool)(bVar68 & 1) * auVar145._0_4_);
          bVar12 = (bool)((byte)(uVar69 >> 1) & 1);
          fVar139 = (float)((uint)bVar12 * auVar84._4_4_ | (uint)!bVar12 * auVar145._4_4_);
          bVar12 = (bool)((byte)(uVar69 >> 2) & 1);
          fVar138 = (float)((uint)bVar12 * auVar84._8_4_ | (uint)!bVar12 * auVar145._8_4_);
          bVar12 = (bool)((byte)(uVar69 >> 3) & 1);
          fVar142 = (float)((uint)bVar12 * auVar84._12_4_ | (uint)!bVar12 * auVar145._12_4_);
          auVar94 = ZEXT1632(CONCAT412(fVar142,CONCAT48(fVar138,CONCAT44(fVar139,fVar136))));
          auVar125._0_4_ =
               (float)((uint)(bVar68 & 1) * auVar105._0_4_ |
                      (uint)!(bool)(bVar68 & 1) * auVar160._0_4_);
          bVar12 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar125._4_4_ = (float)((uint)bVar12 * auVar105._4_4_ | (uint)!bVar12 * auVar160._4_4_);
          bVar12 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar125._8_4_ = (float)((uint)bVar12 * auVar105._8_4_ | (uint)!bVar12 * auVar160._8_4_);
          bVar12 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar125._12_4_ =
               (float)((uint)bVar12 * auVar105._12_4_ | (uint)!bVar12 * auVar160._12_4_);
          fVar165 = (float)((uint)((byte)(uVar69 >> 4) & 1) * auVar105._16_4_);
          auVar125._16_4_ = fVar165;
          fVar157 = (float)((uint)((byte)(uVar69 >> 5) & 1) * auVar105._20_4_);
          auVar125._20_4_ = fVar157;
          fVar158 = (float)((uint)((byte)(uVar69 >> 6) & 1) * auVar105._24_4_);
          auVar125._24_4_ = fVar158;
          iVar1 = (uint)(byte)(uVar69 >> 7) * auVar105._28_4_;
          auVar125._28_4_ = iVar1;
          auVar107 = vblendmps_avx512vl(ZEXT1632(auVar87),auVar93);
          auVar126._0_4_ =
               (uint)(bVar68 & 1) * auVar107._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar146._0_4_;
          bVar12 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar126._4_4_ = (uint)bVar12 * auVar107._4_4_ | (uint)!bVar12 * auVar146._4_4_;
          bVar12 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar126._8_4_ = (uint)bVar12 * auVar107._8_4_ | (uint)!bVar12 * auVar146._8_4_;
          bVar12 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar126._12_4_ = (uint)bVar12 * auVar107._12_4_ | (uint)!bVar12 * auVar146._12_4_;
          auVar126._16_4_ = (uint)((byte)(uVar69 >> 4) & 1) * auVar107._16_4_;
          auVar126._20_4_ = (uint)((byte)(uVar69 >> 5) & 1) * auVar107._20_4_;
          auVar126._24_4_ = (uint)((byte)(uVar69 >> 6) & 1) * auVar107._24_4_;
          auVar126._28_4_ = (uint)(byte)(uVar69 >> 7) * auVar107._28_4_;
          auVar107 = vblendmps_avx512vl(ZEXT1632(auVar85),ZEXT1632(auVar82));
          auVar127._0_4_ =
               (float)((uint)(bVar68 & 1) * auVar107._0_4_ |
                      (uint)!(bool)(bVar68 & 1) * auVar88._0_4_);
          bVar12 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar127._4_4_ = (float)((uint)bVar12 * auVar107._4_4_ | (uint)!bVar12 * auVar88._4_4_);
          bVar12 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar127._8_4_ = (float)((uint)bVar12 * auVar107._8_4_ | (uint)!bVar12 * auVar88._8_4_);
          bVar12 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar127._12_4_ = (float)((uint)bVar12 * auVar107._12_4_ | (uint)!bVar12 * auVar88._12_4_)
          ;
          fVar172 = (float)((uint)((byte)(uVar69 >> 4) & 1) * auVar107._16_4_);
          auVar127._16_4_ = fVar172;
          fVar159 = (float)((uint)((byte)(uVar69 >> 5) & 1) * auVar107._20_4_);
          auVar127._20_4_ = fVar159;
          fVar188 = (float)((uint)((byte)(uVar69 >> 6) & 1) * auVar107._24_4_);
          auVar127._24_4_ = fVar188;
          auVar127._28_4_ = (uint)(byte)(uVar69 >> 7) * auVar107._28_4_;
          auVar107 = vblendmps_avx512vl(ZEXT1632(auVar86),ZEXT1632(auVar89));
          auVar128._0_4_ =
               (float)((uint)(bVar68 & 1) * auVar107._0_4_ |
                      (uint)!(bool)(bVar68 & 1) * auVar84._0_4_);
          bVar12 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar128._4_4_ = (float)((uint)bVar12 * auVar107._4_4_ | (uint)!bVar12 * auVar84._4_4_);
          bVar12 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar128._8_4_ = (float)((uint)bVar12 * auVar107._8_4_ | (uint)!bVar12 * auVar84._8_4_);
          bVar12 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar128._12_4_ = (float)((uint)bVar12 * auVar107._12_4_ | (uint)!bVar12 * auVar84._12_4_)
          ;
          fVar79 = (float)((uint)((byte)(uVar69 >> 4) & 1) * auVar107._16_4_);
          auVar128._16_4_ = fVar79;
          fVar80 = (float)((uint)((byte)(uVar69 >> 5) & 1) * auVar107._20_4_);
          auVar128._20_4_ = fVar80;
          fVar134 = (float)((uint)((byte)(uVar69 >> 6) & 1) * auVar107._24_4_);
          auVar128._24_4_ = fVar134;
          iVar2 = (uint)(byte)(uVar69 >> 7) * auVar107._28_4_;
          auVar128._28_4_ = iVar2;
          auVar129._0_4_ =
               (uint)(bVar68 & 1) * (int)auVar87._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar93._0_4_;
          bVar12 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar129._4_4_ = (uint)bVar12 * (int)auVar87._4_4_ | (uint)!bVar12 * auVar93._4_4_;
          bVar12 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar129._8_4_ = (uint)bVar12 * (int)auVar87._8_4_ | (uint)!bVar12 * auVar93._8_4_;
          bVar12 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar129._12_4_ = (uint)bVar12 * (int)auVar87._12_4_ | (uint)!bVar12 * auVar93._12_4_;
          auVar129._16_4_ = (uint)!(bool)((byte)(uVar69 >> 4) & 1) * auVar93._16_4_;
          auVar129._20_4_ = (uint)!(bool)((byte)(uVar69 >> 5) & 1) * auVar93._20_4_;
          auVar129._24_4_ = (uint)!(bool)((byte)(uVar69 >> 6) & 1) * auVar93._24_4_;
          auVar129._28_4_ = (uint)!SUB81(uVar69 >> 7,0) * auVar93._28_4_;
          bVar12 = (bool)((byte)(uVar69 >> 1) & 1);
          bVar14 = (bool)((byte)(uVar69 >> 2) & 1);
          bVar16 = (bool)((byte)(uVar69 >> 3) & 1);
          bVar13 = (bool)((byte)(uVar69 >> 1) & 1);
          bVar15 = (bool)((byte)(uVar69 >> 2) & 1);
          bVar17 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar93 = vsubps_avx512vl(auVar129,auVar103);
          auVar108 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar85._12_4_ |
                                                   (uint)!bVar16 * auVar82._12_4_,
                                                   CONCAT48((uint)bVar14 * (int)auVar85._8_4_ |
                                                            (uint)!bVar14 * auVar82._8_4_,
                                                            CONCAT44((uint)bVar12 *
                                                                     (int)auVar85._4_4_ |
                                                                     (uint)!bVar12 * auVar82._4_4_,
                                                                     (uint)(bVar68 & 1) *
                                                                     (int)auVar85._0_4_ |
                                                                     (uint)!(bool)(bVar68 & 1) *
                                                                     auVar82._0_4_)))),auVar94);
          auVar206 = ZEXT3264(auVar108);
          auVar105 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar86._12_4_ |
                                                   (uint)!bVar17 * auVar89._12_4_,
                                                   CONCAT48((uint)bVar15 * (int)auVar86._8_4_ |
                                                            (uint)!bVar15 * auVar89._8_4_,
                                                            CONCAT44((uint)bVar13 *
                                                                     (int)auVar86._4_4_ |
                                                                     (uint)!bVar13 * auVar89._4_4_,
                                                                     (uint)(bVar68 & 1) *
                                                                     (int)auVar86._0_4_ |
                                                                     (uint)!(bool)(bVar68 & 1) *
                                                                     auVar89._0_4_)))),auVar125);
          auVar104 = vsubps_avx(auVar103,auVar126);
          auVar211 = ZEXT3264(auVar104);
          auVar91 = vsubps_avx(auVar94,auVar127);
          auVar92 = vsubps_avx(auVar125,auVar128);
          auVar49._4_4_ = auVar105._4_4_ * fVar137;
          auVar49._0_4_ = auVar105._0_4_ * fVar135;
          auVar49._8_4_ = auVar105._8_4_ * fVar140;
          auVar49._12_4_ = auVar105._12_4_ * fVar141;
          auVar49._16_4_ = auVar105._16_4_ * 0.0;
          auVar49._20_4_ = auVar105._20_4_ * 0.0;
          auVar49._24_4_ = auVar105._24_4_ * 0.0;
          auVar49._28_4_ = 0;
          auVar82 = vfmsub231ps_fma(auVar49,auVar125,auVar93);
          auVar186._0_4_ = fVar136 * auVar93._0_4_;
          auVar186._4_4_ = fVar139 * auVar93._4_4_;
          auVar186._8_4_ = fVar138 * auVar93._8_4_;
          auVar186._12_4_ = fVar142 * auVar93._12_4_;
          auVar186._16_4_ = auVar93._16_4_ * 0.0;
          auVar186._20_4_ = auVar93._20_4_ * 0.0;
          auVar186._24_4_ = auVar93._24_4_ * 0.0;
          auVar186._28_4_ = 0;
          auVar89 = vfmsub231ps_fma(auVar186,auVar103,auVar108);
          auVar107 = vfmadd231ps_avx512vl(ZEXT1632(auVar89),auVar99,ZEXT1632(auVar82));
          auVar193._0_4_ = auVar108._0_4_ * auVar125._0_4_;
          auVar193._4_4_ = auVar108._4_4_ * auVar125._4_4_;
          auVar193._8_4_ = auVar108._8_4_ * auVar125._8_4_;
          auVar193._12_4_ = auVar108._12_4_ * auVar125._12_4_;
          auVar193._16_4_ = auVar108._16_4_ * fVar165;
          auVar193._20_4_ = auVar108._20_4_ * fVar157;
          auVar193._24_4_ = auVar108._24_4_ * fVar158;
          auVar193._28_4_ = 0;
          auVar82 = vfmsub231ps_fma(auVar193,auVar94,auVar105);
          auVar95 = vfmadd231ps_avx512vl(auVar107,auVar99,ZEXT1632(auVar82));
          auVar107 = vmulps_avx512vl(auVar92,auVar126);
          auVar107 = vfmsub231ps_avx512vl(auVar107,auVar104,auVar128);
          auVar50._4_4_ = auVar91._4_4_ * auVar128._4_4_;
          auVar50._0_4_ = auVar91._0_4_ * auVar128._0_4_;
          auVar50._8_4_ = auVar91._8_4_ * auVar128._8_4_;
          auVar50._12_4_ = auVar91._12_4_ * auVar128._12_4_;
          auVar50._16_4_ = auVar91._16_4_ * fVar79;
          auVar50._20_4_ = auVar91._20_4_ * fVar80;
          auVar50._24_4_ = auVar91._24_4_ * fVar134;
          auVar50._28_4_ = iVar2;
          auVar82 = vfmsub231ps_fma(auVar50,auVar127,auVar92);
          auVar194._0_4_ = auVar127._0_4_ * auVar104._0_4_;
          auVar194._4_4_ = auVar127._4_4_ * auVar104._4_4_;
          auVar194._8_4_ = auVar127._8_4_ * auVar104._8_4_;
          auVar194._12_4_ = auVar127._12_4_ * auVar104._12_4_;
          auVar194._16_4_ = fVar172 * auVar104._16_4_;
          auVar194._20_4_ = fVar159 * auVar104._20_4_;
          auVar194._24_4_ = fVar188 * auVar104._24_4_;
          auVar194._28_4_ = 0;
          auVar89 = vfmsub231ps_fma(auVar194,auVar91,auVar126);
          auVar107 = vfmadd231ps_avx512vl(ZEXT1632(auVar89),auVar99,auVar107);
          auVar98 = vfmadd231ps_avx512vl(auVar107,auVar99,ZEXT1632(auVar82));
          auVar196 = ZEXT3264(auVar98);
          auVar107 = vmaxps_avx(auVar95,auVar98);
          uVar25 = vcmpps_avx512vl(auVar107,auVar99,2);
          bVar78 = bVar78 & (byte)uVar25;
          if (bVar78 != 0) {
            uVar143 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar226._4_4_ = uVar143;
            auVar226._0_4_ = uVar143;
            auVar226._8_4_ = uVar143;
            auVar226._12_4_ = uVar143;
            auVar226._16_4_ = uVar143;
            auVar226._20_4_ = uVar143;
            auVar226._24_4_ = uVar143;
            auVar226._28_4_ = uVar143;
            auVar227 = ZEXT3264(auVar226);
            auVar51._4_4_ = auVar92._4_4_ * auVar108._4_4_;
            auVar51._0_4_ = auVar92._0_4_ * auVar108._0_4_;
            auVar51._8_4_ = auVar92._8_4_ * auVar108._8_4_;
            auVar51._12_4_ = auVar92._12_4_ * auVar108._12_4_;
            auVar51._16_4_ = auVar92._16_4_ * auVar108._16_4_;
            auVar51._20_4_ = auVar92._20_4_ * auVar108._20_4_;
            auVar51._24_4_ = auVar92._24_4_ * auVar108._24_4_;
            auVar51._28_4_ = auVar107._28_4_;
            auVar19 = vfmsub231ps_fma(auVar51,auVar91,auVar105);
            auVar52._4_4_ = auVar105._4_4_ * auVar104._4_4_;
            auVar52._0_4_ = auVar105._0_4_ * auVar104._0_4_;
            auVar52._8_4_ = auVar105._8_4_ * auVar104._8_4_;
            auVar52._12_4_ = auVar105._12_4_ * auVar104._12_4_;
            auVar52._16_4_ = auVar105._16_4_ * auVar104._16_4_;
            auVar52._20_4_ = auVar105._20_4_ * auVar104._20_4_;
            auVar52._24_4_ = auVar105._24_4_ * auVar104._24_4_;
            auVar52._28_4_ = auVar105._28_4_;
            auVar146 = vfmsub231ps_fma(auVar52,auVar93,auVar92);
            auVar53._4_4_ = auVar91._4_4_ * auVar93._4_4_;
            auVar53._0_4_ = auVar91._0_4_ * auVar93._0_4_;
            auVar53._8_4_ = auVar91._8_4_ * auVar93._8_4_;
            auVar53._12_4_ = auVar91._12_4_ * auVar93._12_4_;
            auVar53._16_4_ = auVar91._16_4_ * auVar93._16_4_;
            auVar53._20_4_ = auVar91._20_4_ * auVar93._20_4_;
            auVar53._24_4_ = auVar91._24_4_ * auVar93._24_4_;
            auVar53._28_4_ = auVar91._28_4_;
            auVar88 = vfmsub231ps_fma(auVar53,auVar104,auVar108);
            auVar82 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar146),ZEXT1632(auVar88));
            auVar89 = vfmadd231ps_fma(ZEXT1632(auVar82),ZEXT1632(auVar19),
                                      ZEXT1232(ZEXT412(0)) << 0x20);
            auVar107 = vrcp14ps_avx512vl(ZEXT1632(auVar89));
            auVar211 = ZEXT3264(auVar107);
            auVar31._8_4_ = 0x3f800000;
            auVar31._0_8_ = 0x3f8000003f800000;
            auVar31._12_4_ = 0x3f800000;
            auVar31._16_4_ = 0x3f800000;
            auVar31._20_4_ = 0x3f800000;
            auVar31._24_4_ = 0x3f800000;
            auVar31._28_4_ = 0x3f800000;
            auVar108 = vfnmadd213ps_avx512vl(auVar107,ZEXT1632(auVar89),auVar31);
            auVar82 = vfmadd132ps_fma(auVar108,auVar107,auVar107);
            auVar206 = ZEXT1664(auVar82);
            auVar54._4_4_ = auVar88._4_4_ * auVar125._4_4_;
            auVar54._0_4_ = auVar88._0_4_ * auVar125._0_4_;
            auVar54._8_4_ = auVar88._8_4_ * auVar125._8_4_;
            auVar54._12_4_ = auVar88._12_4_ * auVar125._12_4_;
            auVar54._16_4_ = fVar165 * 0.0;
            auVar54._20_4_ = fVar157 * 0.0;
            auVar54._24_4_ = fVar158 * 0.0;
            auVar54._28_4_ = iVar1;
            auVar146 = vfmadd231ps_fma(auVar54,auVar94,ZEXT1632(auVar146));
            auVar146 = vfmadd231ps_fma(ZEXT1632(auVar146),auVar103,ZEXT1632(auVar19));
            fVar165 = auVar82._0_4_;
            fVar157 = auVar82._4_4_;
            fVar158 = auVar82._8_4_;
            fVar159 = auVar82._12_4_;
            local_540 = ZEXT1632(CONCAT412(auVar146._12_4_ * fVar159,
                                           CONCAT48(auVar146._8_4_ * fVar158,
                                                    CONCAT44(auVar146._4_4_ * fVar157,
                                                             auVar146._0_4_ * fVar165))));
            auVar217 = ZEXT3264(local_540);
            uVar25 = vcmpps_avx512vl(local_540,auVar226,2);
            auVar67._4_4_ = uStack_4dc;
            auVar67._0_4_ = local_4e0;
            auVar67._8_4_ = uStack_4d8;
            auVar67._12_4_ = uStack_4d4;
            auVar67._16_4_ = uStack_4d0;
            auVar67._20_4_ = uStack_4cc;
            auVar67._24_4_ = uStack_4c8;
            auVar67._28_4_ = uStack_4c4;
            uVar26 = vcmpps_avx512vl(local_540,auVar67,0xd);
            bVar78 = (byte)uVar25 & (byte)uVar26 & bVar78;
            if (bVar78 != 0) {
              uVar73 = vcmpps_avx512vl(ZEXT1632(auVar89),ZEXT1232(ZEXT412(0)) << 0x20,4);
              uVar73 = bVar78 & uVar73;
              if ((char)uVar73 != '\0') {
                fVar172 = auVar95._0_4_ * fVar165;
                fVar188 = auVar95._4_4_ * fVar157;
                auVar55._4_4_ = fVar188;
                auVar55._0_4_ = fVar172;
                fVar79 = auVar95._8_4_ * fVar158;
                auVar55._8_4_ = fVar79;
                fVar80 = auVar95._12_4_ * fVar159;
                auVar55._12_4_ = fVar80;
                fVar134 = auVar95._16_4_ * 0.0;
                auVar55._16_4_ = fVar134;
                fVar135 = auVar95._20_4_ * 0.0;
                auVar55._20_4_ = fVar135;
                fVar136 = auVar95._24_4_ * 0.0;
                auVar55._24_4_ = fVar136;
                auVar55._28_4_ = auVar95._28_4_;
                auVar171._8_4_ = 0x3f800000;
                auVar171._0_8_ = 0x3f8000003f800000;
                auVar171._12_4_ = 0x3f800000;
                auVar171._16_4_ = 0x3f800000;
                auVar171._20_4_ = 0x3f800000;
                auVar171._24_4_ = 0x3f800000;
                auVar171._28_4_ = 0x3f800000;
                auVar107 = vsubps_avx(auVar171,auVar55);
                local_3a0._0_4_ =
                     (float)((uint)(bVar68 & 1) * (int)fVar172 |
                            (uint)!(bool)(bVar68 & 1) * auVar107._0_4_);
                bVar12 = (bool)((byte)(uVar69 >> 1) & 1);
                local_3a0._4_4_ =
                     (float)((uint)bVar12 * (int)fVar188 | (uint)!bVar12 * auVar107._4_4_);
                bVar12 = (bool)((byte)(uVar69 >> 2) & 1);
                local_3a0._8_4_ =
                     (float)((uint)bVar12 * (int)fVar79 | (uint)!bVar12 * auVar107._8_4_);
                bVar12 = (bool)((byte)(uVar69 >> 3) & 1);
                local_3a0._12_4_ =
                     (float)((uint)bVar12 * (int)fVar80 | (uint)!bVar12 * auVar107._12_4_);
                bVar12 = (bool)((byte)(uVar69 >> 4) & 1);
                local_3a0._16_4_ =
                     (float)((uint)bVar12 * (int)fVar134 | (uint)!bVar12 * auVar107._16_4_);
                bVar12 = (bool)((byte)(uVar69 >> 5) & 1);
                local_3a0._20_4_ =
                     (float)((uint)bVar12 * (int)fVar135 | (uint)!bVar12 * auVar107._20_4_);
                bVar12 = (bool)((byte)(uVar69 >> 6) & 1);
                local_3a0._24_4_ =
                     (float)((uint)bVar12 * (int)fVar136 | (uint)!bVar12 * auVar107._24_4_);
                bVar12 = SUB81(uVar69 >> 7,0);
                local_3a0._28_4_ =
                     (float)((uint)bVar12 * auVar95._28_4_ | (uint)!bVar12 * auVar107._28_4_);
                auVar107 = vsubps_avx(auVar97,auVar96);
                auVar82 = vfmadd213ps_fma(auVar107,local_3a0,auVar96);
                uVar143 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
                auVar32._4_4_ = uVar143;
                auVar32._0_4_ = uVar143;
                auVar32._8_4_ = uVar143;
                auVar32._12_4_ = uVar143;
                auVar32._16_4_ = uVar143;
                auVar32._20_4_ = uVar143;
                auVar32._24_4_ = uVar143;
                auVar32._28_4_ = uVar143;
                auVar107 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar82._12_4_ + auVar82._12_4_,
                                                              CONCAT48(auVar82._8_4_ + auVar82._8_4_
                                                                       ,CONCAT44(auVar82._4_4_ +
                                                                                 auVar82._4_4_,
                                                                                 auVar82._0_4_ +
                                                                                 auVar82._0_4_)))),
                                           auVar32);
                uVar27 = vcmpps_avx512vl(local_540,auVar107,6);
                uVar73 = uVar73 & uVar27;
                bVar78 = (byte)uVar73;
                if (bVar78 != 0) {
                  auVar164._0_4_ = auVar98._0_4_ * fVar165;
                  auVar164._4_4_ = auVar98._4_4_ * fVar157;
                  auVar164._8_4_ = auVar98._8_4_ * fVar158;
                  auVar164._12_4_ = auVar98._12_4_ * fVar159;
                  auVar164._16_4_ = auVar98._16_4_ * 0.0;
                  auVar164._20_4_ = auVar98._20_4_ * 0.0;
                  auVar164._24_4_ = auVar98._24_4_ * 0.0;
                  auVar164._28_4_ = 0;
                  auVar187._8_4_ = 0x3f800000;
                  auVar187._0_8_ = 0x3f8000003f800000;
                  auVar187._12_4_ = 0x3f800000;
                  auVar187._16_4_ = 0x3f800000;
                  auVar187._20_4_ = 0x3f800000;
                  auVar187._24_4_ = 0x3f800000;
                  auVar187._28_4_ = 0x3f800000;
                  auVar107 = vsubps_avx(auVar187,auVar164);
                  auVar130._0_4_ =
                       (uint)(bVar68 & 1) * (int)auVar164._0_4_ |
                       (uint)!(bool)(bVar68 & 1) * auVar107._0_4_;
                  bVar12 = (bool)((byte)(uVar69 >> 1) & 1);
                  auVar130._4_4_ =
                       (uint)bVar12 * (int)auVar164._4_4_ | (uint)!bVar12 * auVar107._4_4_;
                  bVar12 = (bool)((byte)(uVar69 >> 2) & 1);
                  auVar130._8_4_ =
                       (uint)bVar12 * (int)auVar164._8_4_ | (uint)!bVar12 * auVar107._8_4_;
                  bVar12 = (bool)((byte)(uVar69 >> 3) & 1);
                  auVar130._12_4_ =
                       (uint)bVar12 * (int)auVar164._12_4_ | (uint)!bVar12 * auVar107._12_4_;
                  bVar12 = (bool)((byte)(uVar69 >> 4) & 1);
                  auVar130._16_4_ =
                       (uint)bVar12 * (int)auVar164._16_4_ | (uint)!bVar12 * auVar107._16_4_;
                  bVar12 = (bool)((byte)(uVar69 >> 5) & 1);
                  auVar130._20_4_ =
                       (uint)bVar12 * (int)auVar164._20_4_ | (uint)!bVar12 * auVar107._20_4_;
                  bVar12 = (bool)((byte)(uVar69 >> 6) & 1);
                  auVar130._24_4_ =
                       (uint)bVar12 * (int)auVar164._24_4_ | (uint)!bVar12 * auVar107._24_4_;
                  auVar130._28_4_ = (uint)!SUB81(uVar69 >> 7,0) * auVar107._28_4_;
                  auVar33._8_4_ = 0x40000000;
                  auVar33._0_8_ = 0x4000000040000000;
                  auVar33._12_4_ = 0x40000000;
                  auVar33._16_4_ = 0x40000000;
                  auVar33._20_4_ = 0x40000000;
                  auVar33._24_4_ = 0x40000000;
                  auVar33._28_4_ = 0x40000000;
                  local_380 = vfmsub132ps_avx512vl(auVar130,auVar187,auVar33);
                  local_340 = (undefined4)lVar75;
                  pGVar76 = (context->scene->geometries).items[uVar74].ptr;
                  if ((pGVar76->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                    auVar82 = vcvtsi2ss_avx512f(auVar90,local_340);
                    fVar165 = auVar82._0_4_;
                    local_2e0[0] = (fVar165 + local_3a0._0_4_ + 0.0) * (float)local_5a0;
                    local_2e0[1] = (fVar165 + local_3a0._4_4_ + 1.0) * local_5a0._4_4_;
                    local_2e0[2] = (fVar165 + local_3a0._8_4_ + 2.0) * fStack_598;
                    local_2e0[3] = (fVar165 + local_3a0._12_4_ + 3.0) * fStack_594;
                    fStack_2d0 = (fVar165 + local_3a0._16_4_ + 4.0) * fStack_590;
                    fStack_2cc = (fVar165 + local_3a0._20_4_ + 5.0) * fStack_58c;
                    fStack_2c8 = (fVar165 + local_3a0._24_4_ + 6.0) * fStack_588;
                    fStack_2c4 = fVar165 + local_3a0._28_4_ + 7.0;
                    local_2c0 = local_380;
                    local_2a0 = local_540;
                    auVar152._8_4_ = 0x7f800000;
                    auVar152._0_8_ = 0x7f8000007f800000;
                    auVar152._12_4_ = 0x7f800000;
                    auVar152._16_4_ = 0x7f800000;
                    auVar152._20_4_ = 0x7f800000;
                    auVar152._24_4_ = 0x7f800000;
                    auVar152._28_4_ = 0x7f800000;
                    auVar107 = vblendmps_avx512vl(auVar152,local_540);
                    auVar131._0_4_ =
                         (uint)(bVar78 & 1) * auVar107._0_4_ |
                         (uint)!(bool)(bVar78 & 1) * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar73 >> 1) & 1);
                    auVar131._4_4_ = (uint)bVar12 * auVar107._4_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar73 >> 2) & 1);
                    auVar131._8_4_ = (uint)bVar12 * auVar107._8_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar73 >> 3) & 1);
                    auVar131._12_4_ = (uint)bVar12 * auVar107._12_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar73 >> 4) & 1);
                    auVar131._16_4_ = (uint)bVar12 * auVar107._16_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar73 >> 5) & 1);
                    auVar131._20_4_ = (uint)bVar12 * auVar107._20_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar73 >> 6) & 1);
                    auVar131._24_4_ = (uint)bVar12 * auVar107._24_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = SUB81(uVar73 >> 7,0);
                    auVar131._28_4_ = (uint)bVar12 * auVar107._28_4_ | (uint)!bVar12 * 0x7f800000;
                    auVar107 = vshufps_avx(auVar131,auVar131,0xb1);
                    auVar107 = vminps_avx(auVar131,auVar107);
                    auVar108 = vshufpd_avx(auVar107,auVar107,5);
                    auVar107 = vminps_avx(auVar107,auVar108);
                    auVar108 = vpermpd_avx2(auVar107,0x4e);
                    auVar107 = vminps_avx(auVar107,auVar108);
                    uVar25 = vcmpps_avx512vl(auVar131,auVar107,0);
                    uVar70 = (uint)uVar73;
                    if (((byte)uVar25 & bVar78) != 0) {
                      uVar70 = (uint)((byte)uVar25 & bVar78);
                    }
                    uVar71 = 0;
                    for (; (uVar70 & 1) == 0; uVar70 = uVar70 >> 1 | 0x80000000) {
                      uVar71 = uVar71 + 1;
                    }
                    uVar69 = (ulong)uVar71;
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar76->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      local_100 = vmovdqa64_avx512vl(auVar228._0_32_);
                      local_5c0._0_4_ = iVar72;
                      local_608 = uVar77;
                      local_360 = local_540;
                      local_33c = iVar72;
                      local_330 = auVar81;
                      local_320 = uVar24;
                      uStack_318 = uVar61;
                      local_310 = uVar62;
                      uStack_308 = uVar63;
                      local_300 = uVar64;
                      uStack_2f8 = uVar65;
                      do {
                        fVar165 = local_2e0[uVar69];
                        auVar162._4_4_ = fVar165;
                        auVar162._0_4_ = fVar165;
                        auVar162._8_4_ = fVar165;
                        auVar162._12_4_ = fVar165;
                        local_1c0._16_4_ = fVar165;
                        local_1c0._0_16_ = auVar162;
                        local_1c0._20_4_ = fVar165;
                        local_1c0._24_4_ = fVar165;
                        local_1c0._28_4_ = fVar165;
                        local_1a0 = *(undefined4 *)(local_2c0 + uVar69 * 4);
                        *(undefined4 *)(ray + k * 4 + 0x100) =
                             *(undefined4 *)(local_2a0 + uVar69 * 4);
                        local_678.context = context->user;
                        fVar157 = 1.0 - fVar165;
                        auVar19 = vfnmadd231ss_fma(ZEXT416((uint)(fVar165 * (fVar157 + fVar157))),
                                                   ZEXT416((uint)fVar157),ZEXT416((uint)fVar157));
                        auVar82 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar162,
                                                  ZEXT416(0xc0a00000));
                        auVar89 = vfmadd231ss_fma(ZEXT416((uint)(fVar165 * fVar165 * 3.0)),
                                                  ZEXT416((uint)(fVar165 + fVar165)),auVar82);
                        auVar211 = ZEXT1664(auVar89);
                        auVar82 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar162,
                                                  ZEXT416(0x40000000));
                        auVar82 = vfmadd231ss_fma(ZEXT416((uint)(fVar157 * fVar157 * -3.0)),
                                                  ZEXT416((uint)(fVar157 + fVar157)),auVar82);
                        auVar146 = vfmadd231ss_fma(ZEXT416((uint)(fVar165 * fVar165)),auVar162,
                                                   ZEXT416((uint)(fVar157 * -2.0)));
                        fVar165 = auVar19._0_4_ * 0.5;
                        fVar157 = auVar89._0_4_ * 0.5;
                        fVar158 = auVar82._0_4_ * 0.5;
                        fVar159 = auVar146._0_4_ * 0.5;
                        auVar181._0_4_ = fVar159 * local_6c0;
                        auVar181._4_4_ = fVar159 * fStack_6bc;
                        auVar181._8_4_ = fVar159 * fStack_6b8;
                        auVar181._12_4_ = fVar159 * fStack_6b4;
                        auVar200._4_4_ = fVar158;
                        auVar200._0_4_ = fVar158;
                        auVar200._8_4_ = fVar158;
                        auVar200._12_4_ = fVar158;
                        auVar82 = vfmadd132ps_fma(auVar200,auVar181,auVar22);
                        auVar182._4_4_ = fVar157;
                        auVar182._0_4_ = fVar157;
                        auVar182._8_4_ = fVar157;
                        auVar182._12_4_ = fVar157;
                        auVar82 = vfmadd132ps_fma(auVar182,auVar82,auVar23);
                        auVar147._4_4_ = fVar165;
                        auVar147._0_4_ = fVar165;
                        auVar147._8_4_ = fVar165;
                        auVar147._12_4_ = fVar165;
                        auVar82 = vfmadd213ps_fma(auVar147,auVar81,auVar82);
                        local_220 = auVar82._0_4_;
                        auVar195._8_4_ = 1;
                        auVar195._0_8_ = 0x100000001;
                        auVar195._12_4_ = 1;
                        auVar195._16_4_ = 1;
                        auVar195._20_4_ = 1;
                        auVar195._24_4_ = 1;
                        auVar195._28_4_ = 1;
                        local_200 = vpermps_avx2(auVar195,ZEXT1632(auVar82));
                        auVar196 = ZEXT3264(local_200);
                        auVar201._8_4_ = 2;
                        auVar201._0_8_ = 0x200000002;
                        auVar201._12_4_ = 2;
                        auVar204._16_4_ = 2;
                        auVar204._0_16_ = auVar201;
                        auVar204._20_4_ = 2;
                        auVar204._24_4_ = 2;
                        auVar204._28_4_ = 2;
                        auVar206 = ZEXT3264(auVar204);
                        local_1e0 = vpermps_avx2(auVar204,ZEXT1632(auVar82));
                        iStack_21c = local_220;
                        iStack_218 = local_220;
                        iStack_214 = local_220;
                        iStack_210 = local_220;
                        iStack_20c = local_220;
                        iStack_208 = local_220;
                        iStack_204 = local_220;
                        uStack_19c = local_1a0;
                        uStack_198 = local_1a0;
                        uStack_194 = local_1a0;
                        uStack_190 = local_1a0;
                        uStack_18c = local_1a0;
                        uStack_188 = local_1a0;
                        uStack_184 = local_1a0;
                        local_180 = local_4c0._0_8_;
                        uStack_178 = local_4c0._8_8_;
                        uStack_170 = local_4c0._16_8_;
                        uStack_168 = local_4c0._24_8_;
                        local_160 = local_500;
                        auVar107 = vpcmpeqd_avx2(local_500,local_500);
                        local_648[1] = auVar107;
                        *local_648 = auVar107;
                        local_140 = (local_678.context)->instID[0];
                        uStack_13c = local_140;
                        uStack_138 = local_140;
                        uStack_134 = local_140;
                        uStack_130 = local_140;
                        uStack_12c = local_140;
                        uStack_128 = local_140;
                        uStack_124 = local_140;
                        local_120 = (local_678.context)->instPrimID[0];
                        uStack_11c = local_120;
                        uStack_118 = local_120;
                        uStack_114 = local_120;
                        uStack_110 = local_120;
                        uStack_10c = local_120;
                        uStack_108 = local_120;
                        uStack_104 = local_120;
                        local_640 = local_260;
                        local_678.valid = (int *)local_640;
                        local_678.geometryUserPtr = pGVar76->userPtr;
                        local_678.hit = (RTCHitN *)&local_220;
                        local_678.N = 8;
                        local_5e0 = auVar227._0_32_;
                        local_678.ray = (RTCRayN *)ray;
                        if (pGVar76->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar196 = ZEXT1664(local_200._0_16_);
                          auVar206 = ZEXT1664(auVar201);
                          auVar211 = ZEXT1664(auVar89);
                          (*pGVar76->intersectionFilterN)(&local_678);
                          auVar217 = ZEXT3264(local_540);
                          auVar227 = ZEXT3264(local_5e0);
                        }
                        if (local_640 == (undefined1  [32])0x0) {
LAB_01ad60da:
                          *(int *)(ray + k * 4 + 0x100) = auVar227._0_4_;
                        }
                        else {
                          p_Var11 = context->args->filter;
                          if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar76->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar196 = ZEXT1664(auVar196._0_16_);
                            auVar206 = ZEXT1664(auVar206._0_16_);
                            auVar211 = ZEXT1664(auVar211._0_16_);
                            (*p_Var11)(&local_678);
                            auVar217 = ZEXT3264(local_540);
                            auVar227 = ZEXT3264(local_5e0);
                          }
                          if (local_640 == (undefined1  [32])0x0) goto LAB_01ad60da;
                          uVar77 = vptestmd_avx512vl(local_640,local_640);
                          iVar72 = *(int *)(local_678.hit + 4);
                          iVar1 = *(int *)(local_678.hit + 8);
                          iVar2 = *(int *)(local_678.hit + 0xc);
                          iVar56 = *(int *)(local_678.hit + 0x10);
                          iVar57 = *(int *)(local_678.hit + 0x14);
                          iVar58 = *(int *)(local_678.hit + 0x18);
                          iVar59 = *(int *)(local_678.hit + 0x1c);
                          bVar78 = (byte)uVar77;
                          bVar12 = (bool)((byte)(uVar77 >> 1) & 1);
                          bVar13 = (bool)((byte)(uVar77 >> 2) & 1);
                          bVar14 = (bool)((byte)(uVar77 >> 3) & 1);
                          bVar15 = (bool)((byte)(uVar77 >> 4) & 1);
                          bVar16 = (bool)((byte)(uVar77 >> 5) & 1);
                          bVar17 = (bool)((byte)(uVar77 >> 6) & 1);
                          bVar18 = SUB81(uVar77 >> 7,0);
                          *(uint *)(local_678.ray + 0x180) =
                               (uint)(bVar78 & 1) * *(int *)local_678.hit |
                               (uint)!(bool)(bVar78 & 1) * *(int *)(local_678.ray + 0x180);
                          *(uint *)(local_678.ray + 0x184) =
                               (uint)bVar12 * iVar72 |
                               (uint)!bVar12 * *(int *)(local_678.ray + 0x184);
                          *(uint *)(local_678.ray + 0x188) =
                               (uint)bVar13 * iVar1 |
                               (uint)!bVar13 * *(int *)(local_678.ray + 0x188);
                          *(uint *)(local_678.ray + 0x18c) =
                               (uint)bVar14 * iVar2 |
                               (uint)!bVar14 * *(int *)(local_678.ray + 0x18c);
                          *(uint *)(local_678.ray + 400) =
                               (uint)bVar15 * iVar56 | (uint)!bVar15 * *(int *)(local_678.ray + 400)
                          ;
                          *(uint *)(local_678.ray + 0x194) =
                               (uint)bVar16 * iVar57 |
                               (uint)!bVar16 * *(int *)(local_678.ray + 0x194);
                          *(uint *)(local_678.ray + 0x198) =
                               (uint)bVar17 * iVar58 |
                               (uint)!bVar17 * *(int *)(local_678.ray + 0x198);
                          *(uint *)(local_678.ray + 0x19c) =
                               (uint)bVar18 * iVar59 |
                               (uint)!bVar18 * *(int *)(local_678.ray + 0x19c);
                          iVar72 = *(int *)(local_678.hit + 0x24);
                          iVar1 = *(int *)(local_678.hit + 0x28);
                          iVar2 = *(int *)(local_678.hit + 0x2c);
                          iVar56 = *(int *)(local_678.hit + 0x30);
                          iVar57 = *(int *)(local_678.hit + 0x34);
                          iVar58 = *(int *)(local_678.hit + 0x38);
                          iVar59 = *(int *)(local_678.hit + 0x3c);
                          bVar12 = (bool)((byte)(uVar77 >> 1) & 1);
                          bVar13 = (bool)((byte)(uVar77 >> 2) & 1);
                          bVar14 = (bool)((byte)(uVar77 >> 3) & 1);
                          bVar15 = (bool)((byte)(uVar77 >> 4) & 1);
                          bVar16 = (bool)((byte)(uVar77 >> 5) & 1);
                          bVar17 = (bool)((byte)(uVar77 >> 6) & 1);
                          bVar18 = SUB81(uVar77 >> 7,0);
                          *(uint *)(local_678.ray + 0x1a0) =
                               (uint)(bVar78 & 1) * *(int *)(local_678.hit + 0x20) |
                               (uint)!(bool)(bVar78 & 1) * *(int *)(local_678.ray + 0x1a0);
                          *(uint *)(local_678.ray + 0x1a4) =
                               (uint)bVar12 * iVar72 |
                               (uint)!bVar12 * *(int *)(local_678.ray + 0x1a4);
                          *(uint *)(local_678.ray + 0x1a8) =
                               (uint)bVar13 * iVar1 |
                               (uint)!bVar13 * *(int *)(local_678.ray + 0x1a8);
                          *(uint *)(local_678.ray + 0x1ac) =
                               (uint)bVar14 * iVar2 |
                               (uint)!bVar14 * *(int *)(local_678.ray + 0x1ac);
                          *(uint *)(local_678.ray + 0x1b0) =
                               (uint)bVar15 * iVar56 |
                               (uint)!bVar15 * *(int *)(local_678.ray + 0x1b0);
                          *(uint *)(local_678.ray + 0x1b4) =
                               (uint)bVar16 * iVar57 |
                               (uint)!bVar16 * *(int *)(local_678.ray + 0x1b4);
                          *(uint *)(local_678.ray + 0x1b8) =
                               (uint)bVar17 * iVar58 |
                               (uint)!bVar17 * *(int *)(local_678.ray + 0x1b8);
                          *(uint *)(local_678.ray + 0x1bc) =
                               (uint)bVar18 * iVar59 |
                               (uint)!bVar18 * *(int *)(local_678.ray + 0x1bc);
                          iVar72 = *(int *)(local_678.hit + 0x44);
                          iVar1 = *(int *)(local_678.hit + 0x48);
                          iVar2 = *(int *)(local_678.hit + 0x4c);
                          iVar56 = *(int *)(local_678.hit + 0x50);
                          iVar57 = *(int *)(local_678.hit + 0x54);
                          iVar58 = *(int *)(local_678.hit + 0x58);
                          iVar59 = *(int *)(local_678.hit + 0x5c);
                          bVar12 = (bool)((byte)(uVar77 >> 1) & 1);
                          bVar13 = (bool)((byte)(uVar77 >> 2) & 1);
                          bVar14 = (bool)((byte)(uVar77 >> 3) & 1);
                          bVar15 = (bool)((byte)(uVar77 >> 4) & 1);
                          bVar16 = (bool)((byte)(uVar77 >> 5) & 1);
                          bVar17 = (bool)((byte)(uVar77 >> 6) & 1);
                          bVar18 = SUB81(uVar77 >> 7,0);
                          *(uint *)(local_678.ray + 0x1c0) =
                               (uint)(bVar78 & 1) * *(int *)(local_678.hit + 0x40) |
                               (uint)!(bool)(bVar78 & 1) * *(int *)(local_678.ray + 0x1c0);
                          *(uint *)(local_678.ray + 0x1c4) =
                               (uint)bVar12 * iVar72 |
                               (uint)!bVar12 * *(int *)(local_678.ray + 0x1c4);
                          *(uint *)(local_678.ray + 0x1c8) =
                               (uint)bVar13 * iVar1 |
                               (uint)!bVar13 * *(int *)(local_678.ray + 0x1c8);
                          *(uint *)(local_678.ray + 0x1cc) =
                               (uint)bVar14 * iVar2 |
                               (uint)!bVar14 * *(int *)(local_678.ray + 0x1cc);
                          *(uint *)(local_678.ray + 0x1d0) =
                               (uint)bVar15 * iVar56 |
                               (uint)!bVar15 * *(int *)(local_678.ray + 0x1d0);
                          *(uint *)(local_678.ray + 0x1d4) =
                               (uint)bVar16 * iVar57 |
                               (uint)!bVar16 * *(int *)(local_678.ray + 0x1d4);
                          *(uint *)(local_678.ray + 0x1d8) =
                               (uint)bVar17 * iVar58 |
                               (uint)!bVar17 * *(int *)(local_678.ray + 0x1d8);
                          *(uint *)(local_678.ray + 0x1dc) =
                               (uint)bVar18 * iVar59 |
                               (uint)!bVar18 * *(int *)(local_678.ray + 0x1dc);
                          iVar72 = *(int *)(local_678.hit + 100);
                          iVar1 = *(int *)(local_678.hit + 0x68);
                          iVar2 = *(int *)(local_678.hit + 0x6c);
                          iVar56 = *(int *)(local_678.hit + 0x70);
                          iVar57 = *(int *)(local_678.hit + 0x74);
                          iVar58 = *(int *)(local_678.hit + 0x78);
                          iVar59 = *(int *)(local_678.hit + 0x7c);
                          bVar12 = (bool)((byte)(uVar77 >> 1) & 1);
                          bVar13 = (bool)((byte)(uVar77 >> 2) & 1);
                          bVar14 = (bool)((byte)(uVar77 >> 3) & 1);
                          bVar15 = (bool)((byte)(uVar77 >> 4) & 1);
                          bVar16 = (bool)((byte)(uVar77 >> 5) & 1);
                          bVar17 = (bool)((byte)(uVar77 >> 6) & 1);
                          bVar18 = SUB81(uVar77 >> 7,0);
                          *(uint *)(local_678.ray + 0x1e0) =
                               (uint)(bVar78 & 1) * *(int *)(local_678.hit + 0x60) |
                               (uint)!(bool)(bVar78 & 1) * *(int *)(local_678.ray + 0x1e0);
                          *(uint *)(local_678.ray + 0x1e4) =
                               (uint)bVar12 * iVar72 |
                               (uint)!bVar12 * *(int *)(local_678.ray + 0x1e4);
                          *(uint *)(local_678.ray + 0x1e8) =
                               (uint)bVar13 * iVar1 |
                               (uint)!bVar13 * *(int *)(local_678.ray + 0x1e8);
                          *(uint *)(local_678.ray + 0x1ec) =
                               (uint)bVar14 * iVar2 |
                               (uint)!bVar14 * *(int *)(local_678.ray + 0x1ec);
                          *(uint *)(local_678.ray + 0x1f0) =
                               (uint)bVar15 * iVar56 |
                               (uint)!bVar15 * *(int *)(local_678.ray + 0x1f0);
                          *(uint *)(local_678.ray + 500) =
                               (uint)bVar16 * iVar57 | (uint)!bVar16 * *(int *)(local_678.ray + 500)
                          ;
                          *(uint *)(local_678.ray + 0x1f8) =
                               (uint)bVar17 * iVar58 |
                               (uint)!bVar17 * *(int *)(local_678.ray + 0x1f8);
                          *(uint *)(local_678.ray + 0x1fc) =
                               (uint)bVar18 * iVar59 |
                               (uint)!bVar18 * *(int *)(local_678.ray + 0x1fc);
                          iVar72 = *(int *)(local_678.hit + 0x84);
                          iVar1 = *(int *)(local_678.hit + 0x88);
                          iVar2 = *(int *)(local_678.hit + 0x8c);
                          iVar56 = *(int *)(local_678.hit + 0x90);
                          iVar57 = *(int *)(local_678.hit + 0x94);
                          iVar58 = *(int *)(local_678.hit + 0x98);
                          iVar59 = *(int *)(local_678.hit + 0x9c);
                          bVar12 = (bool)((byte)(uVar77 >> 1) & 1);
                          bVar13 = (bool)((byte)(uVar77 >> 2) & 1);
                          bVar14 = (bool)((byte)(uVar77 >> 3) & 1);
                          bVar15 = (bool)((byte)(uVar77 >> 4) & 1);
                          bVar16 = (bool)((byte)(uVar77 >> 5) & 1);
                          bVar17 = (bool)((byte)(uVar77 >> 6) & 1);
                          bVar18 = SUB81(uVar77 >> 7,0);
                          *(uint *)(local_678.ray + 0x200) =
                               (uint)(bVar78 & 1) * *(int *)(local_678.hit + 0x80) |
                               (uint)!(bool)(bVar78 & 1) * *(int *)(local_678.ray + 0x200);
                          *(uint *)(local_678.ray + 0x204) =
                               (uint)bVar12 * iVar72 |
                               (uint)!bVar12 * *(int *)(local_678.ray + 0x204);
                          *(uint *)(local_678.ray + 0x208) =
                               (uint)bVar13 * iVar1 |
                               (uint)!bVar13 * *(int *)(local_678.ray + 0x208);
                          *(uint *)(local_678.ray + 0x20c) =
                               (uint)bVar14 * iVar2 |
                               (uint)!bVar14 * *(int *)(local_678.ray + 0x20c);
                          *(uint *)(local_678.ray + 0x210) =
                               (uint)bVar15 * iVar56 |
                               (uint)!bVar15 * *(int *)(local_678.ray + 0x210);
                          *(uint *)(local_678.ray + 0x214) =
                               (uint)bVar16 * iVar57 |
                               (uint)!bVar16 * *(int *)(local_678.ray + 0x214);
                          *(uint *)(local_678.ray + 0x218) =
                               (uint)bVar17 * iVar58 |
                               (uint)!bVar17 * *(int *)(local_678.ray + 0x218);
                          *(uint *)(local_678.ray + 0x21c) =
                               (uint)bVar18 * iVar59 |
                               (uint)!bVar18 * *(int *)(local_678.ray + 0x21c);
                          auVar107 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_678.hit + 0xa0)
                                                       );
                          *(undefined1 (*) [32])(local_678.ray + 0x220) = auVar107;
                          auVar107 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_678.hit + 0xc0)
                                                       );
                          *(undefined1 (*) [32])(local_678.ray + 0x240) = auVar107;
                          auVar107 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_678.hit + 0xe0)
                                                       );
                          *(undefined1 (*) [32])(local_678.ray + 0x260) = auVar107;
                          auVar107 = vmovdqa32_avx512vl(*(undefined1 (*) [32])
                                                         (local_678.hit + 0x100));
                          *(undefined1 (*) [32])(local_678.ray + 0x280) = auVar107;
                          auVar227 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
                        }
                        bVar78 = ~(byte)(1 << ((uint)uVar69 & 0x1f)) & (byte)uVar73;
                        uVar143 = auVar227._0_4_;
                        auVar153._4_4_ = uVar143;
                        auVar153._0_4_ = uVar143;
                        auVar153._8_4_ = uVar143;
                        auVar153._12_4_ = uVar143;
                        auVar153._16_4_ = uVar143;
                        auVar153._20_4_ = uVar143;
                        auVar153._24_4_ = uVar143;
                        auVar153._28_4_ = uVar143;
                        uVar25 = vcmpps_avx512vl(auVar217._0_32_,auVar153,2);
                        if ((bVar78 & (byte)uVar25) == 0) goto LAB_01ad616d;
                        bVar78 = bVar78 & (byte)uVar25;
                        uVar73 = (ulong)bVar78;
                        auVar154._8_4_ = 0x7f800000;
                        auVar154._0_8_ = 0x7f8000007f800000;
                        auVar154._12_4_ = 0x7f800000;
                        auVar154._16_4_ = 0x7f800000;
                        auVar154._20_4_ = 0x7f800000;
                        auVar154._24_4_ = 0x7f800000;
                        auVar154._28_4_ = 0x7f800000;
                        auVar107 = vblendmps_avx512vl(auVar154,auVar217._0_32_);
                        auVar132._0_4_ =
                             (uint)(bVar78 & 1) * auVar107._0_4_ |
                             (uint)!(bool)(bVar78 & 1) * 0x7f800000;
                        bVar12 = (bool)(bVar78 >> 1 & 1);
                        auVar132._4_4_ = (uint)bVar12 * auVar107._4_4_ | (uint)!bVar12 * 0x7f800000;
                        bVar12 = (bool)(bVar78 >> 2 & 1);
                        auVar132._8_4_ = (uint)bVar12 * auVar107._8_4_ | (uint)!bVar12 * 0x7f800000;
                        bVar12 = (bool)(bVar78 >> 3 & 1);
                        auVar132._12_4_ =
                             (uint)bVar12 * auVar107._12_4_ | (uint)!bVar12 * 0x7f800000;
                        bVar12 = (bool)(bVar78 >> 4 & 1);
                        auVar132._16_4_ =
                             (uint)bVar12 * auVar107._16_4_ | (uint)!bVar12 * 0x7f800000;
                        bVar12 = (bool)(bVar78 >> 5 & 1);
                        auVar132._20_4_ =
                             (uint)bVar12 * auVar107._20_4_ | (uint)!bVar12 * 0x7f800000;
                        bVar12 = (bool)(bVar78 >> 6 & 1);
                        auVar132._24_4_ =
                             (uint)bVar12 * auVar107._24_4_ | (uint)!bVar12 * 0x7f800000;
                        auVar132._28_4_ =
                             (uint)(bVar78 >> 7) * auVar107._28_4_ |
                             (uint)!(bool)(bVar78 >> 7) * 0x7f800000;
                        auVar107 = vshufps_avx(auVar132,auVar132,0xb1);
                        auVar107 = vminps_avx(auVar132,auVar107);
                        auVar108 = vshufpd_avx(auVar107,auVar107,5);
                        auVar107 = vminps_avx(auVar107,auVar108);
                        auVar108 = vpermpd_avx2(auVar107,0x4e);
                        auVar107 = vminps_avx(auVar107,auVar108);
                        uVar25 = vcmpps_avx512vl(auVar132,auVar107,0);
                        bVar68 = (byte)uVar25 & bVar78;
                        if (bVar68 != 0) {
                          bVar78 = bVar68;
                        }
                        uVar70 = 0;
                        for (uVar71 = (uint)bVar78; (uVar71 & 1) == 0;
                            uVar71 = uVar71 >> 1 | 0x80000000) {
                          uVar70 = uVar70 + 1;
                        }
                        uVar69 = (ulong)uVar70;
                      } while( true );
                    }
                    fVar165 = local_2e0[uVar69];
                    uVar143 = *(undefined4 *)(local_2c0 + uVar69 * 4);
                    fVar157 = 1.0 - fVar165;
                    auVar19 = vfnmadd231ss_fma(ZEXT416((uint)(fVar165 * (fVar157 + fVar157))),
                                               ZEXT416((uint)fVar157),ZEXT416((uint)fVar157));
                    auVar146 = ZEXT416((uint)fVar165);
                    auVar82 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar146,
                                              ZEXT416(0xc0a00000));
                    auVar89 = vfmadd231ss_fma(ZEXT416((uint)(fVar165 * fVar165 * 3.0)),
                                              ZEXT416((uint)(fVar165 + fVar165)),auVar82);
                    auVar211 = ZEXT1664(auVar89);
                    auVar82 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar146,
                                              ZEXT416(0x40000000));
                    auVar82 = vfmadd231ss_fma(ZEXT416((uint)(fVar157 * fVar157 * -3.0)),
                                              ZEXT416((uint)(fVar157 + fVar157)),auVar82);
                    auVar146 = vfmadd231ss_fma(ZEXT416((uint)(fVar165 * fVar165)),auVar146,
                                               ZEXT416((uint)(fVar157 * -2.0)));
                    fVar157 = auVar19._0_4_ * 0.5;
                    fVar158 = auVar89._0_4_ * 0.5;
                    auVar196 = ZEXT464((uint)fVar158);
                    fVar159 = auVar82._0_4_ * 0.5;
                    fVar172 = auVar146._0_4_ * 0.5;
                    auVar179._0_4_ = fVar172 * local_6c0;
                    auVar179._4_4_ = fVar172 * fStack_6bc;
                    auVar179._8_4_ = fVar172 * fStack_6b8;
                    auVar179._12_4_ = fVar172 * fStack_6b4;
                    auVar199._4_4_ = fVar159;
                    auVar199._0_4_ = fVar159;
                    auVar199._8_4_ = fVar159;
                    auVar199._12_4_ = fVar159;
                    auVar82 = vfmadd132ps_fma(auVar199,auVar179,auVar20);
                    auVar206 = ZEXT1664(auVar82);
                    auVar180._4_4_ = fVar158;
                    auVar180._0_4_ = fVar158;
                    auVar180._8_4_ = fVar158;
                    auVar180._12_4_ = fVar158;
                    auVar82 = vfmadd132ps_fma(auVar180,auVar82,auVar21);
                    auVar169._4_4_ = fVar157;
                    auVar169._0_4_ = fVar157;
                    auVar169._8_4_ = fVar157;
                    auVar169._12_4_ = fVar157;
                    auVar82 = vfmadd213ps_fma(auVar169,auVar81,auVar82);
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2a0 + uVar69 * 4);
                    *(int *)(ray + k * 4 + 0x180) = auVar82._0_4_;
                    uVar10 = vextractps_avx(auVar82,1);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar10;
                    uVar10 = vextractps_avx(auVar82,2);
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar10;
                    *(float *)(ray + k * 4 + 0x1e0) = fVar165;
                    *(undefined4 *)(ray + k * 4 + 0x200) = uVar143;
                    *(uint *)(ray + k * 4 + 0x220) = uVar9;
                    *(uint *)(ray + k * 4 + 0x240) = uVar74;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  }
                }
              }
            }
          }
        }
        goto LAB_01ad5d60;
      }
LAB_01ad53cc:
      uVar143 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar29._4_4_ = uVar143;
      auVar29._0_4_ = uVar143;
      auVar29._8_4_ = uVar143;
      auVar29._12_4_ = uVar143;
      uVar24 = vcmpps_avx512vl(local_270,auVar29,2);
      uVar74 = (uint)uVar77 & (uint)uVar24;
      uVar77 = (ulong)uVar74;
    } while (uVar74 != 0);
  }
  return;
LAB_01ad616d:
  auVar82 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar229 = ZEXT1664(auVar82);
  auVar230 = ZEXT3264(local_560);
  auVar231 = ZEXT3264(local_580);
  auVar107 = vmovdqa64_avx512vl(local_100);
  auVar228 = ZEXT3264(auVar107);
  uVar77 = local_608;
  iVar72 = local_5c0._0_4_;
LAB_01ad5d60:
  lVar75 = lVar75 + 8;
  if (iVar72 <= (int)lVar75) goto LAB_01ad53cc;
  goto LAB_01ad5471;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }